

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bson.c
# Opt level: O3

void test_bson_append_int32(void)

{
  char cVar1;
  int iVar2;
  bson_t *pbVar3;
  bson_t *pbVar4;
  char *pcVar5;
  byte *pbVar6;
  bson_t *pbVar7;
  bson_t *b;
  char *pcVar8;
  undefined8 uVar9;
  uint uVar10;
  code *pcVar11;
  code **ppcVar12;
  code **__haystack;
  char *unaff_R12;
  long *plVar13;
  undefined1 *unaff_R13;
  undefined1 *puVar14;
  undefined1 *puVar15;
  char *pcVar16;
  long lStack_1040;
  int iStack_1034;
  undefined1 auStack_1030 [8];
  char *pcStack_1028;
  undefined4 uStack_1020;
  undefined4 uStack_101c;
  undefined2 uStack_1018;
  undefined2 uStack_1016;
  undefined4 uStack_1014;
  undefined2 uStack_1010;
  undefined8 uStack_100e;
  undefined1 auStack_1000 [128];
  undefined1 auStack_f80 [368];
  undefined1 *puStack_e10;
  code *pcStack_e08;
  long lStack_d98;
  undefined7 uStack_d90;
  char cStack_d89;
  undefined1 uStack_d88;
  undefined1 auStack_d80 [128];
  undefined1 auStack_d00 [376];
  code *apcStack_b88 [16];
  undefined1 auStack_b08 [8];
  undefined1 auStack_b00 [128];
  undefined1 auStack_a80 [128];
  undefined1 auStack_a00 [272];
  undefined8 uStack_8f0;
  char *pcStack_8e8;
  char *pcStack_8e0;
  bson_t *pbStack_8d8;
  undefined8 uStack_8d0;
  char *pcStack_8c8;
  char *pcStack_8c0;
  bson_t *pbStack_8b8;
  long *plStack_8b0;
  bson_t *pbStack_8a8;
  bson_t *pbStack_8a0;
  char *pcStack_898;
  code *apcStack_890 [2];
  long lStack_880;
  int iStack_878;
  int iStack_874;
  undefined1 auStack_870 [504];
  char acStack_678 [72];
  bson_t *pbStack_630;
  char *pcStack_628;
  undefined1 *puStack_620;
  char *pcStack_618;
  bson_t *pbStack_610;
  code *pcStack_608;
  int iStack_58c;
  undefined1 auStack_588 [8];
  undefined1 auStack_580 [248];
  bson_t *pbStack_488;
  code *apcStack_480 [2];
  bson_t *pbStack_470;
  bson_t *pbStack_468;
  bson_t *pbStack_460;
  code *pcStack_458;
  undefined8 uStack_450;
  undefined4 uStack_448;
  bson_t *pbStack_440;
  bson_t *pbStack_438;
  code *pcStack_430;
  bson_t *pbStack_420;
  bson_t *pbStack_418;
  undefined1 auStack_408 [24];
  bson_t *apbStack_3f0 [2];
  bson_t *pbStack_3e0;
  bson_t *apbStack_3d8 [2];
  bson_t *pbStack_3c8;
  bson_t *apbStack_3c0 [2];
  bson_t *pbStack_3b0;
  bson_t *apbStack_3a8 [2];
  bson_t *pbStack_398;
  code *apcStack_390 [2];
  bson_t *pbStack_380;
  code *pcStack_378;
  undefined1 auStack_364 [12];
  bson_t *pbStack_358;
  code *pcStack_350;
  bson_t *pbStack_340;
  code *pcStack_338;
  bson_t *pbStack_328;
  code *pcStack_320;
  char *pcStack_310;
  code *pcStack_308;
  undefined1 auStack_300 [128];
  undefined1 auStack_280 [128];
  char acStack_200 [376];
  bson_t *pbStack_88;
  undefined8 uStack_50;
  undefined8 uStack_48;
  bson_t *pbStack_40;
  
  pbVar3 = (bson_t *)bson_new();
  cVar1 = bson_append_int32(pbVar3,"a",0xffffffff,0xffffff85);
  if (cVar1 == '\0') {
    test_bson_append_int32_cold_1();
LAB_00121b06:
    test_bson_append_int32_cold_2();
  }
  else {
    cVar1 = bson_append_int32(pbVar3,"c",0xffffffff,0);
    if (cVar1 == '\0') goto LAB_00121b06;
    cVar1 = bson_append_int32(pbVar3,"b",0xffffffff,0x7b);
    if (cVar1 != '\0') {
      pbVar4 = get_bson("test33.bson");
      BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
      bson_destroy(pbVar3);
      bson_destroy(pbVar4);
      return;
    }
  }
  test_bson_append_int32_cold_3();
  pbVar3 = (bson_t *)bson_new();
  cVar1 = bson_append_int64(pbVar3,"a",0xffffffff,100000000000000);
  if (cVar1 != '\0') {
    pbVar4 = get_bson("test34.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    bson_destroy(pbVar3);
    bson_destroy(pbVar4);
    return;
  }
  test_bson_append_int64_cold_1();
  uStack_48 = 0;
  uStack_50 = 1;
  pbStack_40 = pbVar3;
  pbVar3 = (bson_t *)bson_new();
  cVar1 = bson_append_decimal128(pbVar3,"a",0xffffffff,&uStack_50);
  if (cVar1 != '\0') {
    pbVar4 = get_bson("test58.bson");
    BSON_ASSERT_BSON_EQUAL(pbVar3,pbVar4);
    bson_destroy(pbVar3);
    bson_destroy(pbVar4);
    return;
  }
  test_bson_append_decimal128_cold_1();
  puVar14 = auStack_300;
  puVar15 = auStack_300;
  pcVar16 = acStack_200;
  pcStack_308 = (code *)0x121c11;
  pbStack_88 = pbVar3;
  bson_init(pcVar16);
  pbVar3 = (bson_t *)0x14c71a;
  pcStack_308 = (code *)0x121c2d;
  bson_append_int32(pcVar16,"a",1,1);
  pcStack_308 = (code *)0x121c46;
  bson_append_int32(pcVar16,"b",1,2);
  pcStack_308 = (code *)0x121c5f;
  bson_append_int32(pcVar16,"c",1,3);
  pcStack_308 = (code *)0x121c83;
  bson_append_utf8(pcVar16,"d",1,"hello",5);
  pcStack_308 = (code *)0x121c90;
  bson_init(auStack_280);
  pcStack_308 = (code *)0x121c9e;
  cVar1 = bson_iter_init_find(auStack_300,pcVar16,"a");
  if (cVar1 == '\0') {
    pcStack_308 = (code *)0x121ebe;
    test_bson_append_iter_cold_1();
LAB_00121ebe:
    pcStack_308 = (code *)0x121ec3;
    test_bson_append_iter_cold_2();
LAB_00121ec3:
    pcStack_308 = (code *)0x121ec8;
    test_bson_append_iter_cold_3();
LAB_00121ec8:
    pcStack_308 = (code *)0x121ecd;
    test_bson_append_iter_cold_4();
LAB_00121ecd:
    pcStack_308 = (code *)0x121ed2;
    test_bson_append_iter_cold_5();
LAB_00121ed2:
    pcStack_308 = (code *)0x121ed7;
    test_bson_append_iter_cold_6();
LAB_00121ed7:
    pcStack_308 = (code *)0x121edc;
    test_bson_append_iter_cold_7();
LAB_00121edc:
    pcStack_308 = (code *)0x121ee1;
    test_bson_append_iter_cold_11();
    puVar14 = unaff_R13;
LAB_00121ee1:
    pcStack_308 = (code *)0x121ee6;
    test_bson_append_iter_cold_15();
LAB_00121ee6:
    pcStack_308 = (code *)0x121eeb;
    test_bson_append_iter_cold_9();
LAB_00121eeb:
    pcStack_308 = (code *)0x121ef0;
    test_bson_append_iter_cold_10();
LAB_00121ef0:
    pcStack_308 = (code *)0x121ef5;
    test_bson_append_iter_cold_13();
LAB_00121ef5:
    pcStack_308 = (code *)0x121efa;
    test_bson_append_iter_cold_14();
    puVar15 = puVar14;
LAB_00121efa:
    pcStack_308 = (code *)0x121eff;
    test_bson_append_iter_cold_16();
LAB_00121eff:
    pcStack_308 = (code *)0x121f07;
    test_bson_append_iter_cold_8();
LAB_00121f07:
    pcStack_308 = (code *)0x121f0f;
    test_bson_append_iter_cold_12();
LAB_00121f0f:
    pcStack_308 = (code *)0x121f17;
    test_bson_append_iter_cold_17();
  }
  else {
    pcStack_308 = (code *)0x121cba;
    cVar1 = bson_append_iter(auStack_280,0,0,auStack_300);
    if (cVar1 == '\0') goto LAB_00121ebe;
    unaff_R12 = "c";
    pcStack_308 = (code *)0x121cdc;
    cVar1 = bson_iter_init_find(auStack_300,acStack_200,"c");
    if (cVar1 == '\0') goto LAB_00121ec3;
    pcStack_308 = (code *)0x121cf8;
    cVar1 = bson_append_iter(auStack_280,0,0,auStack_300);
    if (cVar1 == '\0') goto LAB_00121ec8;
    pcStack_308 = (code *)0x121d17;
    cVar1 = bson_iter_init_find(auStack_300,acStack_200,"d");
    if (cVar1 == '\0') goto LAB_00121ecd;
    pcVar16 = "world";
    pcStack_308 = (code *)0x121d3e;
    cVar1 = bson_append_iter(auStack_280,"world",0xffffffff,auStack_300);
    if (cVar1 == '\0') goto LAB_00121ed2;
    pcStack_308 = (code *)0x121d59;
    bson_iter_init(auStack_300,auStack_280);
    pcStack_308 = (code *)0x121d61;
    cVar1 = bson_iter_next(auStack_300);
    unaff_R13 = auStack_300;
    if (cVar1 == '\0') goto LAB_00121ed7;
    pcStack_308 = (code *)0x121d71;
    pcVar5 = (char *)bson_iter_key(auStack_300);
    if (pcVar5 != "a") {
      pcStack_308 = (code *)0x121d7e;
      pbVar6 = (byte *)bson_iter_key(auStack_300);
      uVar10 = *pbVar6 - 0x61;
      if (uVar10 == 0) {
        uVar10 = (uint)pbVar6[1];
      }
      if (uVar10 == 0) goto LAB_00121d94;
      goto LAB_00121eff;
    }
LAB_00121d94:
    pcStack_308 = (code *)0x121d9c;
    iVar2 = bson_iter_type(auStack_300);
    if (iVar2 != 0x10) goto LAB_00121ee6;
    pcStack_308 = (code *)0x121dad;
    iVar2 = bson_iter_int32(auStack_300);
    puVar14 = auStack_300;
    if (iVar2 != 1) goto LAB_00121eeb;
    pcStack_308 = (code *)0x121dbe;
    cVar1 = bson_iter_next(auStack_300);
    unaff_R13 = auStack_300;
    if (cVar1 == '\0') goto LAB_00121edc;
    pcStack_308 = (code *)0x121dce;
    pcVar5 = (char *)bson_iter_key(auStack_300);
    if (pcVar5 != "c") {
      pcStack_308 = (code *)0x121ddb;
      pbVar6 = (byte *)bson_iter_key(auStack_300);
      uVar10 = *pbVar6 - 99;
      if (uVar10 == 0) {
        uVar10 = (uint)pbVar6[1];
      }
      puVar15 = auStack_300;
      if (uVar10 == 0) goto LAB_00121df1;
      goto LAB_00121f07;
    }
LAB_00121df1:
    pcStack_308 = (code *)0x121df9;
    iVar2 = bson_iter_type(auStack_300);
    puVar14 = auStack_300;
    if (iVar2 != 0x10) goto LAB_00121ef0;
    pcStack_308 = (code *)0x121e0a;
    iVar2 = bson_iter_int32(auStack_300);
    puVar14 = auStack_300;
    if (iVar2 != 3) goto LAB_00121ef5;
    pcStack_308 = (code *)0x121e1b;
    cVar1 = bson_iter_next(auStack_300);
    puVar14 = auStack_300;
    if (cVar1 == '\0') goto LAB_00121ee1;
    pcStack_308 = (code *)0x121e2b;
    iVar2 = bson_iter_type(auStack_300);
    puVar15 = auStack_300;
    if (iVar2 != 2) goto LAB_00121efa;
    pcStack_308 = (code *)0x121e3c;
    pcVar5 = (char *)bson_iter_key(auStack_300);
    if (pcVar5 != "world") {
      pcStack_308 = (code *)0x121e49;
      pcVar5 = (char *)bson_iter_key(auStack_300);
      pcStack_308 = (code *)0x121e58;
      iVar2 = strcmp("world",pcVar5);
      puVar15 = auStack_300;
      if (iVar2 == 0) goto LAB_00121e60;
      goto LAB_00121f0f;
    }
LAB_00121e60:
    pcStack_308 = (code *)0x121e6a;
    pcVar5 = (char *)bson_iter_utf8(auStack_300,0);
    if (pcVar5 == "hello") {
LAB_00121e90:
      pcStack_308 = (code *)0x121e9d;
      bson_destroy(acStack_200);
      pcStack_308 = (code *)0x121eaa;
      bson_destroy(auStack_280);
      return;
    }
    pcStack_308 = (code *)0x121e79;
    pcVar5 = (char *)bson_iter_utf8(auStack_300,0);
    pcStack_308 = (code *)0x121e88;
    iVar2 = strcmp("hello",pcVar5);
    puVar15 = auStack_300;
    if (iVar2 == 0) goto LAB_00121e90;
  }
  pcStack_308 = test_bson_append_maxkey;
  test_bson_append_iter_cold_18();
  pcStack_310 = "hello";
  pcStack_320 = (code *)0x121f28;
  pcStack_308 = (code *)pcVar16;
  pbVar4 = (bson_t *)bson_new();
  pcStack_320 = (code *)0x121f3f;
  cVar1 = bson_append_maxkey(pbVar4,"maxkey",0xffffffff);
  if (cVar1 != '\0') {
    pcStack_320 = (code *)0x121f4f;
    pbVar3 = get_bson("test37.bson");
    pcStack_320 = (code *)0x121f5d;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pcStack_320 = (code *)0x121f65;
    bson_destroy(pbVar4);
    bson_destroy(pbVar3);
    return;
  }
  pcStack_320 = test_bson_append_minkey;
  test_bson_append_maxkey_cold_1();
  pcStack_338 = (code *)0x121f82;
  pbStack_328 = pbVar4;
  pcStack_320 = (code *)pcVar16;
  pbVar4 = (bson_t *)bson_new();
  pcStack_338 = (code *)0x121f99;
  cVar1 = bson_append_minkey(pbVar4,"minkey",0xffffffff);
  if (cVar1 != '\0') {
    pcStack_338 = (code *)0x121fa9;
    pbVar3 = get_bson("test36.bson");
    pcStack_338 = (code *)0x121fb7;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pcStack_338 = (code *)0x121fbf;
    bson_destroy(pbVar4);
    bson_destroy(pbVar3);
    return;
  }
  pcStack_338 = test_bson_append_null;
  test_bson_append_minkey_cold_1();
  pcStack_350 = (code *)0x121fdc;
  pbStack_340 = pbVar4;
  pcStack_338 = (code *)pcVar16;
  pbVar4 = (bson_t *)bson_new();
  pcStack_350 = (code *)0x121ff3;
  cVar1 = bson_append_null(pbVar4,"hello",0xffffffff);
  if (cVar1 != '\0') {
    pcStack_350 = (code *)0x122003;
    pbVar3 = get_bson("test18.bson");
    pcStack_350 = (code *)0x122011;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pcStack_350 = (code *)0x122019;
    bson_destroy(pbVar4);
    bson_destroy(pbVar3);
    return;
  }
  pcStack_350 = test_bson_append_oid;
  test_bson_append_null_cold_1();
  pcStack_378 = (code *)0x122048;
  pbStack_358 = pbVar4;
  pcStack_350 = (code *)pcVar16;
  bson_oid_init_from_string(auStack_364,"1234567890abcdef1234abcd");
  pcStack_378 = (code *)0x12204d;
  pbVar4 = (bson_t *)bson_new();
  pcStack_378 = (code *)0x122067;
  cVar1 = bson_append_oid(pbVar4,"oid",0xffffffff,auStack_364);
  if (cVar1 != '\0') {
    pcStack_378 = (code *)0x122077;
    pbVar3 = get_bson("test22.bson");
    pcStack_378 = (code *)0x122085;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pcStack_378 = (code *)0x12208d;
    bson_destroy(pbVar4);
    pcStack_378 = (code *)0x122095;
    bson_destroy(pbVar3);
    return;
  }
  pcStack_378 = test_bson_append_regex;
  test_bson_append_oid_cold_1();
  apcStack_390[0] = (code *)0x1220ab;
  pbStack_380 = pbVar4;
  pcStack_378 = (code *)auStack_364;
  pbVar4 = (bson_t *)bson_new();
  apcStack_390[0] = (code *)0x1220d0;
  cVar1 = bson_append_regex(pbVar4,"regex",0xffffffff,"^abcd","ilx");
  if (cVar1 != '\0') {
    apcStack_390[0] = (code *)0x1220e0;
    pbVar3 = get_bson("test27.bson");
    apcStack_390[0] = (code *)0x1220ee;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    apcStack_390[0] = (code *)0x1220f6;
    bson_destroy(pbVar4);
    bson_destroy(pbVar3);
    return;
  }
  apcStack_390[0] = test_bson_append_utf8;
  test_bson_append_regex_cold_1();
  apbStack_3a8[0] = (bson_t *)0x122113;
  pbStack_398 = pbVar4;
  apcStack_390[0] = (code *)auStack_364;
  pbVar4 = (bson_t *)bson_new();
  apbStack_3a8[0] = (bson_t *)0x122122;
  pbVar7 = get_bson("test11.bson");
  apbStack_3a8[0] = (bson_t *)0x122146;
  cVar1 = bson_append_utf8(pbVar4,"hello",0xffffffff,"world",0xffffffff);
  if (cVar1 != '\0') {
    apbStack_3a8[0] = (bson_t *)0x122155;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar7);
    apbStack_3a8[0] = (bson_t *)0x12215d;
    bson_destroy(pbVar4);
    bson_destroy(pbVar7);
    return;
  }
  apbStack_3a8[0] = (bson_t *)test_bson_append_symbol;
  test_bson_append_utf8_cold_1();
  apbStack_3c0[0] = (bson_t *)0x12217a;
  pbStack_3b0 = pbVar4;
  apbStack_3a8[0] = pbVar7;
  pbVar4 = (bson_t *)bson_new();
  apbStack_3c0[0] = (bson_t *)0x122189;
  pbVar7 = get_bson("test32.bson");
  apbStack_3c0[0] = (bson_t *)0x1221ad;
  cVar1 = bson_append_symbol(pbVar4,"hello",0xffffffff,"world",0xffffffff);
  if (cVar1 != '\0') {
    apbStack_3c0[0] = (bson_t *)0x1221bc;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar7);
    apbStack_3c0[0] = (bson_t *)0x1221c4;
    bson_destroy(pbVar4);
    bson_destroy(pbVar7);
    return;
  }
  apbStack_3c0[0] = (bson_t *)test_bson_append_time_t;
  test_bson_append_symbol_cold_1();
  apbStack_3d8[0] = (bson_t *)0x1221e1;
  pbStack_3c8 = pbVar4;
  apbStack_3c0[0] = pbVar7;
  pbVar4 = (bson_t *)bson_new();
  apbStack_3d8[0] = (bson_t *)0x1221fd;
  cVar1 = bson_append_time_t(pbVar4,"time_t",0xffffffff,0x499602d2);
  if (cVar1 != '\0') {
    apbStack_3d8[0] = (bson_t *)0x12220d;
    pbVar3 = get_bson("test26.bson");
    apbStack_3d8[0] = (bson_t *)0x12221b;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    apbStack_3d8[0] = (bson_t *)0x122223;
    bson_destroy(pbVar4);
    bson_destroy(pbVar3);
    return;
  }
  apbStack_3d8[0] = (bson_t *)test_bson_append_timestamp;
  test_bson_append_time_t_cold_1();
  apbStack_3f0[0] = (bson_t *)0x122240;
  pbStack_3e0 = pbVar4;
  apbStack_3d8[0] = pbVar7;
  pbVar4 = (bson_t *)bson_new();
  apbStack_3f0[0] = (bson_t *)0x122262;
  cVar1 = bson_append_timestamp(pbVar4,"timestamp",0xffffffff,0x4d2,0x2694);
  if (cVar1 != '\0') {
    apbStack_3f0[0] = (bson_t *)0x122272;
    pbVar3 = get_bson("test35.bson");
    apbStack_3f0[0] = (bson_t *)0x122280;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    apbStack_3f0[0] = (bson_t *)0x122288;
    bson_destroy(pbVar4);
    bson_destroy(pbVar3);
    return;
  }
  apbStack_3f0[0] = (bson_t *)test_bson_append_timeval;
  test_bson_append_timestamp_cold_1();
  b = (bson_t *)auStack_408;
  auStack_408._0_4_ = 0x499602d2;
  auStack_408._4_4_ = 0;
  auStack_408[8] = '\0';
  auStack_408[9] = '\0';
  auStack_408[10] = '\0';
  auStack_408[0xb] = '\0';
  auStack_408[0xc] = '\0';
  auStack_408[0xd] = '\0';
  auStack_408[0xe] = '\0';
  auStack_408[0xf] = '\0';
  pbStack_418 = (bson_t *)0x1222bc;
  auStack_408._16_8_ = pbVar4;
  apbStack_3f0[0] = pbVar7;
  pbVar4 = (bson_t *)bson_new();
  pbStack_418 = (bson_t *)0x1222d6;
  cVar1 = bson_append_timeval(pbVar4,"time_t",0xffffffff,b);
  if (cVar1 != '\0') {
    pbStack_418 = (bson_t *)0x1222e6;
    pbVar3 = get_bson("test26.bson");
    pbStack_418 = (bson_t *)0x1222f4;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pbStack_418 = (bson_t *)0x1222fc;
    bson_destroy(pbVar4);
    pbStack_418 = (bson_t *)0x122304;
    bson_destroy(pbVar3);
    return;
  }
  pbStack_418 = (bson_t *)test_bson_append_undefined;
  test_bson_append_timeval_cold_1();
  pcStack_430 = (code *)0x12231a;
  pbStack_420 = pbVar4;
  pbStack_418 = b;
  pbVar4 = (bson_t *)bson_new();
  pcStack_430 = (code *)0x122331;
  cVar1 = bson_append_undefined(pbVar4,"undefined",0xffffffff);
  if (cVar1 != '\0') {
    pcStack_430 = (code *)0x122341;
    pbVar3 = get_bson("test25.bson");
    pcStack_430 = (code *)0x12234f;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pcStack_430 = (code *)0x122357;
    bson_destroy(pbVar4);
    bson_destroy(pbVar3);
    return;
  }
  pcStack_430 = test_bson_append_general;
  test_bson_append_undefined_cold_1();
  pcStack_430 = (code *)0x14c71a;
  pcStack_458 = (code *)0x122379;
  pbStack_440 = pbVar4;
  pbStack_438 = b;
  pbVar4 = (bson_t *)bson_new();
  pcStack_458 = (code *)0x122395;
  cVar1 = bson_append_int32(pbVar4,"int",0xffffffff,1);
  if (cVar1 == '\0') {
    pcStack_458 = (code *)0x122bb1;
    test_bson_append_general_cold_1();
LAB_00122bb1:
    pcStack_458 = (code *)0x122bb6;
    test_bson_append_general_cold_2();
LAB_00122bb6:
    pcStack_458 = (code *)0x122bbb;
    test_bson_append_general_cold_3();
LAB_00122bbb:
    pcStack_458 = (code *)0x122bc0;
    test_bson_append_general_cold_4();
LAB_00122bc0:
    pcStack_458 = (code *)0x122bc5;
    test_bson_append_general_cold_5();
LAB_00122bc5:
    pcStack_458 = (code *)0x122bca;
    test_bson_append_general_cold_6();
LAB_00122bca:
    pcStack_458 = (code *)0x122bcf;
    test_bson_append_general_cold_7();
LAB_00122bcf:
    pcStack_458 = (code *)0x122bd4;
    test_bson_append_general_cold_8();
LAB_00122bd4:
    pcStack_458 = (code *)0x122bd9;
    test_bson_append_general_cold_9();
LAB_00122bd9:
    pcStack_458 = (code *)0x122bde;
    test_bson_append_general_cold_10();
LAB_00122bde:
    pcStack_458 = (code *)0x122be3;
    test_bson_append_general_cold_11();
LAB_00122be3:
    pcStack_458 = (code *)0x122be8;
    test_bson_append_general_cold_12();
LAB_00122be8:
    pcStack_458 = (code *)0x122bed;
    test_bson_append_general_cold_13();
LAB_00122bed:
    pcStack_458 = (code *)0x122bf2;
    test_bson_append_general_cold_14();
LAB_00122bf2:
    pcStack_458 = (code *)0x122bf7;
    test_bson_append_general_cold_15();
LAB_00122bf7:
    pcStack_458 = (code *)0x122bfc;
    test_bson_append_general_cold_16();
LAB_00122bfc:
    pcStack_458 = (code *)0x122c01;
    test_bson_append_general_cold_17();
LAB_00122c01:
    pcStack_458 = (code *)0x122c06;
    test_bson_append_general_cold_18();
LAB_00122c06:
    pcStack_458 = (code *)0x122c0b;
    test_bson_append_general_cold_19();
LAB_00122c0b:
    pcStack_458 = (code *)0x122c10;
    test_bson_append_general_cold_20();
LAB_00122c10:
    pcStack_458 = (code *)0x122c15;
    test_bson_append_general_cold_21();
LAB_00122c15:
    pcStack_458 = (code *)0x122c1a;
    test_bson_append_general_cold_22();
LAB_00122c1a:
    pcStack_458 = (code *)0x122c1f;
    test_bson_append_general_cold_23();
LAB_00122c1f:
    pcStack_458 = (code *)0x122c24;
    test_bson_append_general_cold_24();
LAB_00122c24:
    pcStack_458 = (code *)0x122c29;
    test_bson_append_general_cold_25();
LAB_00122c29:
    pcStack_458 = (code *)0x122c2e;
    test_bson_append_general_cold_26();
LAB_00122c2e:
    pcStack_458 = (code *)0x122c33;
    test_bson_append_general_cold_27();
LAB_00122c33:
    pcStack_458 = (code *)0x122c38;
    test_bson_append_general_cold_28();
LAB_00122c38:
    pcStack_458 = (code *)0x122c3d;
    test_bson_append_general_cold_29();
LAB_00122c3d:
    pcStack_458 = (code *)0x122c42;
    test_bson_append_general_cold_30();
LAB_00122c42:
    pcStack_458 = (code *)0x122c47;
    test_bson_append_general_cold_31();
LAB_00122c47:
    pcStack_458 = (code *)0x122c4c;
    test_bson_append_general_cold_32();
LAB_00122c4c:
    pcStack_458 = (code *)0x122c51;
    test_bson_append_general_cold_33();
LAB_00122c51:
    pcStack_458 = (code *)0x122c56;
    test_bson_append_general_cold_34();
LAB_00122c56:
    pcStack_458 = (code *)0x122c5b;
    test_bson_append_general_cold_35();
LAB_00122c5b:
    pcStack_458 = (code *)0x122c60;
    test_bson_append_general_cold_36();
LAB_00122c60:
    pcStack_458 = (code *)0x122c65;
    test_bson_append_general_cold_37();
  }
  else {
    pcStack_458 = (code *)0x1223a9;
    b = get_bson("test1.bson");
    pcStack_458 = (code *)0x1223b7;
    BSON_ASSERT_BSON_EQUAL(pbVar4,b);
    pcStack_458 = (code *)0x1223bf;
    bson_destroy(b);
    pcStack_458 = (code *)0x1223c7;
    bson_destroy(pbVar4);
    pcStack_458 = (code *)0x1223cc;
    pbVar4 = (bson_t *)bson_new();
    pcStack_458 = (code *)0x1223e8;
    cVar1 = bson_append_int64(pbVar4,"int64",0xffffffff,1);
    if (cVar1 == '\0') goto LAB_00122bb1;
    pcStack_458 = (code *)0x1223fc;
    b = get_bson("test2.bson");
    pcStack_458 = (code *)0x12240a;
    BSON_ASSERT_BSON_EQUAL(pbVar4,b);
    pcStack_458 = (code *)0x122412;
    bson_destroy(b);
    pcStack_458 = (code *)0x12241a;
    bson_destroy(pbVar4);
    pcStack_458 = (code *)0x12241f;
    pbVar4 = (bson_t *)bson_new();
    pcStack_458 = (code *)0x12243e;
    cVar1 = bson_append_double(0xd916872b,pbVar4,"double",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122bb6;
    pcStack_458 = (code *)0x122452;
    b = get_bson("test3.bson");
    pcStack_458 = (code *)0x122460;
    BSON_ASSERT_BSON_EQUAL(pbVar4,b);
    pcStack_458 = (code *)0x122468;
    bson_destroy(b);
    pcStack_458 = (code *)0x122470;
    bson_destroy(pbVar4);
    pcStack_458 = (code *)0x122475;
    pbVar4 = (bson_t *)bson_new();
    pcStack_458 = (code *)0x122499;
    cVar1 = bson_append_utf8(pbVar4,"string",0xffffffff,"some string",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122bbb;
    pcStack_458 = (code *)0x1224ad;
    pbVar7 = get_bson("test5.bson");
    pcStack_458 = (code *)0x1224bb;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar7);
    pcStack_458 = (code *)0x1224c3;
    bson_destroy(pbVar7);
    pcStack_458 = (code *)0x1224cb;
    bson_destroy(pbVar4);
    pcStack_458 = (code *)0x1224d0;
    pbVar4 = (bson_t *)bson_new();
    pcStack_458 = (code *)0x1224d8;
    b = (bson_t *)bson_new();
    pcStack_458 = (code *)0x1224f4;
    cVar1 = bson_append_int32(b,"0",0xffffffff,1);
    if (cVar1 == '\0') goto LAB_00122bc0;
    pcStack_458 = (code *)0x122515;
    cVar1 = bson_append_int32(b,"1",0xffffffff,2);
    if (cVar1 == '\0') goto LAB_00122bc5;
    pcStack_458 = (code *)0x122536;
    cVar1 = bson_append_int32(b,"2",0xffffffff,3);
    if (cVar1 == '\0') goto LAB_00122bca;
    pcStack_458 = (code *)0x122557;
    cVar1 = bson_append_int32(b,"3",0xffffffff,4);
    if (cVar1 == '\0') goto LAB_00122bcf;
    pcStack_458 = (code *)0x122578;
    cVar1 = bson_append_int32(b,"4",0xffffffff,5);
    if (cVar1 == '\0') goto LAB_00122bd4;
    pcStack_458 = (code *)0x122599;
    cVar1 = bson_append_int32(b,"5",0xffffffff,6);
    if (cVar1 == '\0') goto LAB_00122bd9;
    pcStack_458 = (code *)0x1225b8;
    cVar1 = bson_append_array(pbVar4,"array[int]",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122bde;
    pcStack_458 = (code *)0x1225cc;
    pbVar3 = get_bson("test6.bson");
    pcStack_458 = (code *)0x1225da;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pcStack_458 = (code *)0x1225e2;
    bson_destroy(pbVar3);
    pcStack_458 = (code *)0x1225ea;
    bson_destroy(b);
    pcStack_458 = (code *)0x1225f2;
    bson_destroy(pbVar4);
    pcStack_458 = (code *)0x1225f7;
    pbVar4 = (bson_t *)bson_new();
    pcStack_458 = (code *)0x1225ff;
    b = (bson_t *)bson_new();
    pcStack_458 = (code *)0x12261e;
    cVar1 = bson_append_double(0xd916872b,b,"0",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122be3;
    pcStack_458 = (code *)0x122642;
    cVar1 = bson_append_double(0x6c8b4396,b,"1",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122be8;
    pcStack_458 = (code *)0x122661;
    cVar1 = bson_append_array(pbVar4,"array[double]",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122bed;
    pcStack_458 = (code *)0x122675;
    pbVar3 = get_bson("test7.bson");
    pcStack_458 = (code *)0x122683;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pcStack_458 = (code *)0x12268b;
    bson_destroy(pbVar3);
    pcStack_458 = (code *)0x122693;
    bson_destroy(b);
    pcStack_458 = (code *)0x12269b;
    bson_destroy(pbVar4);
    pcStack_458 = (code *)0x1226a0;
    pbVar4 = (bson_t *)bson_new();
    pcStack_458 = (code *)0x1226a8;
    b = (bson_t *)bson_new();
    pcStack_458 = (code *)0x1226c4;
    cVar1 = bson_append_int32(b,"int",0xffffffff,1);
    if (cVar1 == '\0') goto LAB_00122bf2;
    pcStack_458 = (code *)0x1226e3;
    cVar1 = bson_append_document(pbVar4,"document",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122bf7;
    pcStack_458 = (code *)0x1226f7;
    pbVar3 = get_bson("test8.bson");
    pcStack_458 = (code *)0x122705;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
    pcStack_458 = (code *)0x12270d;
    bson_destroy(pbVar3);
    pcStack_458 = (code *)0x122715;
    bson_destroy(b);
    pcStack_458 = (code *)0x12271d;
    bson_destroy(pbVar4);
    pcStack_458 = (code *)0x122722;
    pbVar4 = (bson_t *)bson_new();
    pcStack_458 = (code *)0x122739;
    cVar1 = bson_append_null(pbVar4,"null",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122bfc;
    pcStack_458 = (code *)0x12274d;
    b = get_bson("test9.bson");
    pcStack_458 = (code *)0x12275b;
    BSON_ASSERT_BSON_EQUAL(pbVar4,b);
    pcStack_458 = (code *)0x122763;
    bson_destroy(b);
    pcStack_458 = (code *)0x12276b;
    bson_destroy(pbVar4);
    pcStack_458 = (code *)0x122770;
    pbVar4 = (bson_t *)bson_new();
    pcStack_458 = (code *)0x122795;
    cVar1 = bson_append_regex(pbVar4,"regex",0xffffffff,"1234","i");
    if (cVar1 == '\0') goto LAB_00122c01;
    pcStack_458 = (code *)0x1227a9;
    b = get_bson("test10.bson");
    pcStack_458 = (code *)0x1227b7;
    BSON_ASSERT_BSON_EQUAL(pbVar4,b);
    pcStack_458 = (code *)0x1227bf;
    bson_destroy(b);
    pcStack_458 = (code *)0x1227c7;
    bson_destroy(pbVar4);
    pcStack_458 = (code *)0x1227cc;
    pbVar4 = (bson_t *)bson_new();
    pcStack_458 = (code *)0x1227f0;
    cVar1 = bson_append_utf8(pbVar4,"hello",0xffffffff,"world",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c06;
    pcStack_458 = (code *)0x122804;
    pbVar7 = get_bson("test11.bson");
    pcStack_458 = (code *)0x122812;
    BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar7);
    pcStack_458 = (code *)0x12281a;
    bson_destroy(pbVar7);
    pcStack_458 = (code *)0x122822;
    bson_destroy(pbVar4);
    pcStack_458 = (code *)0x122827;
    b = (bson_t *)bson_new();
    pcStack_458 = (code *)0x12282f;
    pbVar4 = (bson_t *)bson_new();
    pcStack_458 = (code *)0x122853;
    cVar1 = bson_append_utf8(pbVar4,"0",0xffffffff,"awesome",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c0b;
    pcStack_458 = (code *)0x122877;
    cVar1 = bson_append_double(0x33333333,pbVar4,"1",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c10;
    pcStack_458 = (code *)0x122898;
    cVar1 = bson_append_int32(pbVar4,"2",0xffffffff,0x7c2);
    if (cVar1 == '\0') goto LAB_00122c15;
    pcStack_458 = (code *)0x1228b7;
    cVar1 = bson_append_array(b,"BSON",0xffffffff,pbVar4);
    if (cVar1 == '\0') goto LAB_00122c1a;
    pcStack_458 = (code *)0x1228cb;
    pbVar3 = get_bson("test12.bson");
    pcStack_458 = (code *)0x1228d9;
    BSON_ASSERT_BSON_EQUAL(b,pbVar3);
    pcStack_458 = (code *)0x1228e1;
    bson_destroy(pbVar3);
    pcStack_458 = (code *)0x1228e9;
    bson_destroy(b);
    pcStack_458 = (code *)0x1228f1;
    bson_destroy(pbVar4);
    pcStack_458 = (code *)0x1228f6;
    pbVar4 = (bson_t *)bson_new();
    uStack_450 = 0;
    uStack_448 = 0x45230100;
    pcStack_458 = (code *)0x12291e;
    cVar1 = bson_append_oid(pbVar4,"_id",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c1f;
    pcStack_458 = (code *)0x12292b;
    b = (bson_t *)bson_new();
    pcStack_458 = (code *)0x122945;
    cVar1 = bson_append_oid(b,"_id",0xffffffff,&uStack_450);
    if (cVar1 == '\0') goto LAB_00122c24;
    pcStack_458 = (code *)0x122952;
    pbVar3 = (bson_t *)bson_new();
    pcStack_458 = (code *)0x122976;
    cVar1 = bson_append_utf8(pbVar3,"0",0xffffffff,"1",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c29;
    pcStack_458 = (code *)0x12299f;
    cVar1 = bson_append_utf8(pbVar3,"1",0xffffffff,"2",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c2e;
    pcStack_458 = (code *)0x1229c8;
    cVar1 = bson_append_utf8(pbVar3,"2",0xffffffff,"3",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c33;
    pcStack_458 = (code *)0x1229f1;
    cVar1 = bson_append_utf8(pbVar3,"3",0xffffffff,"4",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c38;
    pcStack_458 = (code *)0x122a10;
    cVar1 = bson_append_array(b,"tags",0xffffffff,pbVar3);
    if (cVar1 == '\0') goto LAB_00122c3d;
    pcStack_458 = (code *)0x122a20;
    bson_destroy(pbVar3);
    pcStack_458 = (code *)0x122a41;
    cVar1 = bson_append_utf8(b,"text",0xffffffff,"asdfanother",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c42;
    pcStack_458 = (code *)0x122a4e;
    pbVar3 = (bson_t *)bson_new();
    pcStack_458 = (code *)0x122a72;
    cVar1 = bson_append_utf8(pbVar3,"name",0xffffffff,"blah",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c47;
    pcStack_458 = (code *)0x122a91;
    cVar1 = bson_append_document(b,"source",0xffffffff,pbVar3);
    if (cVar1 == '\0') goto LAB_00122c4c;
    pcStack_458 = (code *)0x122aa1;
    bson_destroy(pbVar3);
    pcStack_458 = (code *)0x122ab8;
    cVar1 = bson_append_document(pbVar4,"document",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122c51;
    pcStack_458 = (code *)0x122ac8;
    bson_destroy(b);
    pcStack_458 = (code *)0x122acd;
    b = (bson_t *)bson_new();
    pcStack_458 = (code *)0x122af1;
    cVar1 = bson_append_utf8(b,"0",0xffffffff,"source",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c56;
    pcStack_458 = (code *)0x122b10;
    cVar1 = bson_append_array(pbVar4,"type",0xffffffff,b);
    if (cVar1 == '\0') goto LAB_00122c5b;
    pcStack_458 = (code *)0x122b20;
    bson_destroy(b);
    pcStack_458 = (code *)0x122b25;
    b = (bson_t *)bson_new();
    pcStack_458 = (code *)0x122b49;
    cVar1 = bson_append_utf8(b,"0",0xffffffff,"server_created_at",0xffffffff);
    if (cVar1 == '\0') goto LAB_00122c60;
    pcStack_458 = (code *)0x122b68;
    cVar1 = bson_append_array(pbVar4,"missing",0xffffffff,b);
    if (cVar1 != '\0') {
      pcStack_458 = (code *)0x122b78;
      bson_destroy(b);
      pcStack_458 = (code *)0x122b84;
      pbVar3 = get_bson("test17.bson");
      pcStack_458 = (code *)0x122b92;
      BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
      pcStack_458 = (code *)0x122b9a;
      bson_destroy(pbVar3);
      pcStack_458 = (code *)0x122ba2;
      bson_destroy(pbVar4);
      return;
    }
  }
  pcStack_458 = test_bson_append_deep;
  test_bson_append_general_cold_38();
  pcVar11 = (code *)0x64;
  apcStack_480[0] = (code *)0x122c7b;
  pbStack_470 = pbVar4;
  pbStack_468 = b;
  pbStack_460 = pbVar3;
  pcStack_458 = (code *)&stack0xffffffffffffffa0;
  pbVar3 = (bson_t *)bson_new();
  while( true ) {
    apcStack_480[0] = (code *)0x122c8a;
    pbVar4 = (bson_t *)bson_new();
    apcStack_480[0] = (code *)0x122ca0;
    cVar1 = bson_append_document(pbVar4,"a",0xffffffff,pbVar3);
    if (cVar1 == '\0') break;
    apcStack_480[0] = (code *)0x122cac;
    bson_destroy(pbVar3);
    uVar10 = (int)pcVar11 - 1;
    pcVar11 = (code *)(ulong)uVar10;
    pbVar3 = pbVar4;
    if (uVar10 == 0) {
      apcStack_480[0] = (code *)0x122cbf;
      pbVar3 = get_bson("test38.bson");
      apcStack_480[0] = (code *)0x122ccd;
      BSON_ASSERT_BSON_EQUAL(pbVar4,pbVar3);
      apcStack_480[0] = (code *)0x122cd5;
      bson_destroy(pbVar3);
      bson_destroy(pbVar4);
      return;
    }
  }
  apcStack_480[0] = test_bson_utf8_key;
  test_bson_append_deep_cold_1();
  __haystack = apcStack_480;
  pcStack_608 = (code *)0x122d08;
  pbStack_488 = pbVar4;
  apcStack_480[0] = pcVar11;
  pbVar4 = get_bson("eurokey.bson");
  pcStack_608 = (code *)0x122d1a;
  cVar1 = bson_validate(pbVar4,0,auStack_588);
  if (cVar1 == '\0') {
    pcStack_608 = (code *)0x122dac;
    test_bson_utf8_key_cold_1();
LAB_00122dac:
    pcStack_608 = (code *)0x122db1;
    test_bson_utf8_key_cold_2();
LAB_00122db1:
    pcStack_608 = (code *)0x122db6;
    test_bson_utf8_key_cold_3();
LAB_00122db6:
    pcStack_608 = (code *)0x122dbb;
    test_bson_utf8_key_cold_4();
LAB_00122dbb:
    pcStack_608 = (code *)0x122dc0;
    test_bson_utf8_key_cold_7();
LAB_00122dc0:
    pcStack_608 = (code *)0x122dc5;
    test_bson_utf8_key_cold_5();
  }
  else {
    pcStack_608 = (code *)0x122d32;
    cVar1 = bson_iter_init(auStack_580,pbVar4);
    if (cVar1 == '\0') goto LAB_00122dac;
    pcStack_608 = (code *)0x122d43;
    cVar1 = bson_iter_next(auStack_580);
    if (cVar1 == '\0') goto LAB_00122db1;
    pcStack_608 = (code *)0x122d54;
    pcVar16 = (char *)bson_iter_key(auStack_580);
    pcStack_608 = (code *)0x122d63;
    iVar2 = strcmp(pcVar16,anon_var_dwarf_48e4);
    if (iVar2 != 0) goto LAB_00122db6;
    pcStack_608 = (code *)0x122d79;
    pcVar16 = (char *)bson_iter_utf8(auStack_580,&iStack_58c);
    if (pcVar16 == (char *)0x0) goto LAB_00122dbb;
    if (iStack_58c != 0xf) goto LAB_00122dc0;
    pcStack_608 = (code *)0x122d94;
    iVar2 = strcmp(pcVar16,anon_var_dwarf_48e4);
    if (iVar2 == 0) {
      pcStack_608 = (code *)0x122da0;
      bson_destroy(pbVar4);
      return;
    }
  }
  pcStack_608 = test_bson_validate;
  test_bson_utf8_key_cold_6();
  pcStack_618 = "a";
  pbVar7 = (bson_t *)0x1;
  pcVar5 = "test%u.bson";
  pcVar16 = acStack_678;
  plVar13 = &lStack_880;
  pbStack_630 = pbVar4;
  pcStack_628 = unaff_R12;
  puStack_620 = puVar15;
  pbStack_610 = pbVar3;
  pcStack_608 = (code *)apcStack_480;
  do {
    apcStack_890[0] = (code *)0x122e08;
    bson_snprintf(pcVar16,0x40,"test%u.bson",pbVar7);
    apcStack_890[0] = (code *)0x122e10;
    pbVar3 = get_bson(pcVar16);
    apcStack_890[0] = (code *)0x122e20;
    cVar1 = bson_validate(pbVar3,0,plVar13);
    if (cVar1 == '\0') {
      apcStack_890[0] = (code *)0x123d60;
      test_bson_validate_cold_1();
      goto LAB_00123d60;
    }
    apcStack_890[0] = (code *)0x122e30;
    bson_destroy(pbVar3);
    uVar10 = (int)pbVar7 + 1;
    pbVar7 = (bson_t *)(ulong)uVar10;
  } while (uVar10 != 0x27);
  apcStack_890[0] = (code *)0x122e43;
  pbVar7 = get_bson("codewscope.bson");
  apcStack_890[0] = (code *)0x122e55;
  cVar1 = bson_validate(pbVar7,0,&lStack_880);
  if (cVar1 == '\0') {
LAB_00123d60:
    apcStack_890[0] = (code *)0x123d65;
    test_bson_validate_cold_2();
LAB_00123d65:
    apcStack_890[0] = (code *)0x123d6a;
    test_bson_validate_cold_3();
LAB_00123d6a:
    apcStack_890[0] = (code *)0x123d6f;
    test_bson_validate_cold_158();
LAB_00123d6f:
    apcStack_890[0] = (code *)0x123d74;
    test_bson_validate_cold_157();
LAB_00123d74:
    apcStack_890[0] = (code *)0x123d79;
    test_bson_validate_cold_155();
LAB_00123d79:
    apcStack_890[0] = (code *)0x123d7e;
    test_bson_validate_cold_154();
LAB_00123d7e:
    apcStack_890[0] = (code *)0x123d83;
    test_bson_validate_cold_152();
LAB_00123d83:
    apcStack_890[0] = (code *)0x123d88;
    test_bson_validate_cold_151();
LAB_00123d88:
    apcStack_890[0] = (code *)0x123d8d;
    test_bson_validate_cold_149();
LAB_00123d8d:
    apcStack_890[0] = (code *)0x123d92;
    test_bson_validate_cold_148();
LAB_00123d92:
    apcStack_890[0] = (code *)0x123d97;
    test_bson_validate_cold_146();
LAB_00123d97:
    apcStack_890[0] = (code *)0x123d9c;
    test_bson_validate_cold_145();
LAB_00123d9c:
    apcStack_890[0] = (code *)0x123da1;
    test_bson_validate_cold_143();
LAB_00123da1:
    apcStack_890[0] = (code *)0x123da6;
    test_bson_validate_cold_142();
LAB_00123da6:
    apcStack_890[0] = (code *)0x123dab;
    test_bson_validate_cold_140();
LAB_00123dab:
    apcStack_890[0] = (code *)0x123db0;
    test_bson_validate_cold_139();
LAB_00123db0:
    apcStack_890[0] = (code *)0x123db5;
    test_bson_validate_cold_137();
LAB_00123db5:
    apcStack_890[0] = (code *)0x123dba;
    test_bson_validate_cold_136();
LAB_00123dba:
    apcStack_890[0] = (code *)0x123dbf;
    test_bson_validate_cold_134();
LAB_00123dbf:
    apcStack_890[0] = (code *)0x123dc4;
    test_bson_validate_cold_133();
LAB_00123dc4:
    apcStack_890[0] = (code *)0x123dc9;
    test_bson_validate_cold_131();
LAB_00123dc9:
    apcStack_890[0] = (code *)0x123dce;
    test_bson_validate_cold_130();
LAB_00123dce:
    apcStack_890[0] = (code *)0x123dd3;
    test_bson_validate_cold_128();
LAB_00123dd3:
    apcStack_890[0] = (code *)0x123dd8;
    test_bson_validate_cold_127();
LAB_00123dd8:
    apcStack_890[0] = (code *)0x123ddd;
    test_bson_validate_cold_125();
LAB_00123ddd:
    apcStack_890[0] = (code *)0x123de2;
    test_bson_validate_cold_124();
LAB_00123de2:
    apcStack_890[0] = (code *)0x123de7;
    test_bson_validate_cold_122();
LAB_00123de7:
    apcStack_890[0] = (code *)0x123dec;
    test_bson_validate_cold_121();
LAB_00123dec:
    apcStack_890[0] = (code *)0x123df1;
    test_bson_validate_cold_119();
LAB_00123df1:
    apcStack_890[0] = (code *)0x123df6;
    test_bson_validate_cold_118();
LAB_00123df6:
    apcStack_890[0] = (code *)0x123dfb;
    test_bson_validate_cold_116();
LAB_00123dfb:
    apcStack_890[0] = (code *)0x123e00;
    test_bson_validate_cold_115();
LAB_00123e00:
    apcStack_890[0] = (code *)0x123e05;
    test_bson_validate_cold_113();
LAB_00123e05:
    apcStack_890[0] = (code *)0x123e0a;
    test_bson_validate_cold_112();
LAB_00123e0a:
    apcStack_890[0] = (code *)0x123e0f;
    test_bson_validate_cold_110();
LAB_00123e0f:
    apcStack_890[0] = (code *)0x123e14;
    test_bson_validate_cold_109();
LAB_00123e14:
    apcStack_890[0] = (code *)0x123e19;
    test_bson_validate_cold_107();
LAB_00123e19:
    apcStack_890[0] = (code *)0x123e1e;
    test_bson_validate_cold_106();
LAB_00123e1e:
    apcStack_890[0] = (code *)0x123e23;
    test_bson_validate_cold_104();
LAB_00123e23:
    apcStack_890[0] = (code *)0x123e28;
    test_bson_validate_cold_103();
LAB_00123e28:
    apcStack_890[0] = (code *)0x123e2d;
    test_bson_validate_cold_101();
LAB_00123e2d:
    apcStack_890[0] = (code *)0x123e32;
    test_bson_validate_cold_100();
LAB_00123e32:
    apcStack_890[0] = (code *)0x123e37;
    test_bson_validate_cold_98();
LAB_00123e37:
    apcStack_890[0] = (code *)0x123e3c;
    test_bson_validate_cold_97();
LAB_00123e3c:
    apcStack_890[0] = (code *)0x123e41;
    test_bson_validate_cold_95();
LAB_00123e41:
    apcStack_890[0] = (code *)0x123e46;
    test_bson_validate_cold_94();
LAB_00123e46:
    apcStack_890[0] = (code *)0x123e4b;
    test_bson_validate_cold_92();
LAB_00123e4b:
    apcStack_890[0] = (code *)0x123e50;
    test_bson_validate_cold_91();
LAB_00123e50:
    apcStack_890[0] = (code *)0x123e55;
    test_bson_validate_cold_73();
LAB_00123e55:
    apcStack_890[0] = (code *)0x123e5a;
    test_bson_validate_cold_74();
LAB_00123e5a:
    apcStack_890[0] = (code *)0x123e5f;
    test_bson_validate_cold_75();
LAB_00123e5f:
    apcStack_890[0] = (code *)0x123e64;
    test_bson_validate_cold_89();
LAB_00123e64:
    apcStack_890[0] = (code *)0x123e69;
    test_bson_validate_cold_78();
LAB_00123e69:
    apcStack_890[0] = (code *)0x123e6e;
    test_bson_validate_cold_87();
LAB_00123e6e:
    apcStack_890[0] = (code *)0x123e73;
    test_bson_validate_cold_81();
LAB_00123e73:
    apcStack_890[0] = (code *)0x123e78;
    test_bson_validate_cold_85();
    ppcVar12 = __haystack;
LAB_00123e78:
    apcStack_890[0] = (code *)0x123e7d;
    test_bson_validate_cold_4();
LAB_00123e7d:
    apcStack_890[0] = (code *)0x123e82;
    test_bson_validate_cold_5();
    __haystack = ppcVar12;
LAB_00123e82:
    apcStack_890[0] = (code *)0x123e87;
    test_bson_validate_cold_6();
LAB_00123e87:
    apcStack_890[0] = (code *)0x123e8f;
    test_bson_validate_cold_156();
LAB_00123e8f:
    apcStack_890[0] = (code *)0x123e94;
    test_bson_validate_cold_7();
LAB_00123e94:
    apcStack_890[0] = (code *)0x123e99;
    test_bson_validate_cold_8();
LAB_00123e99:
    apcStack_890[0] = (code *)0x123e9e;
    test_bson_validate_cold_9();
LAB_00123e9e:
    apcStack_890[0] = (code *)0x123ea6;
    test_bson_validate_cold_153();
LAB_00123ea6:
    apcStack_890[0] = (code *)0x123eab;
    test_bson_validate_cold_10();
LAB_00123eab:
    apcStack_890[0] = (code *)0x123eb0;
    test_bson_validate_cold_11();
LAB_00123eb0:
    apcStack_890[0] = (code *)0x123eb5;
    test_bson_validate_cold_12();
LAB_00123eb5:
    apcStack_890[0] = (code *)0x123ebd;
    test_bson_validate_cold_150();
LAB_00123ebd:
    apcStack_890[0] = (code *)0x123ec2;
    test_bson_validate_cold_13();
LAB_00123ec2:
    apcStack_890[0] = (code *)0x123ec7;
    test_bson_validate_cold_14();
LAB_00123ec7:
    apcStack_890[0] = (code *)0x123ecc;
    test_bson_validate_cold_15();
LAB_00123ecc:
    apcStack_890[0] = (code *)0x123ed4;
    test_bson_validate_cold_147();
LAB_00123ed4:
    apcStack_890[0] = (code *)0x123ed9;
    test_bson_validate_cold_16();
LAB_00123ed9:
    apcStack_890[0] = (code *)0x123ede;
    test_bson_validate_cold_17();
LAB_00123ede:
    apcStack_890[0] = (code *)0x123ee3;
    test_bson_validate_cold_18();
LAB_00123ee3:
    apcStack_890[0] = (code *)0x123eeb;
    test_bson_validate_cold_144();
LAB_00123eeb:
    apcStack_890[0] = (code *)0x123ef0;
    test_bson_validate_cold_19();
LAB_00123ef0:
    apcStack_890[0] = (code *)0x123ef5;
    test_bson_validate_cold_20();
LAB_00123ef5:
    apcStack_890[0] = (code *)0x123efa;
    test_bson_validate_cold_21();
LAB_00123efa:
    apcStack_890[0] = (code *)0x123f02;
    test_bson_validate_cold_141();
LAB_00123f02:
    apcStack_890[0] = (code *)0x123f07;
    test_bson_validate_cold_22();
LAB_00123f07:
    apcStack_890[0] = (code *)0x123f0c;
    test_bson_validate_cold_23();
LAB_00123f0c:
    apcStack_890[0] = (code *)0x123f11;
    test_bson_validate_cold_24();
LAB_00123f11:
    apcStack_890[0] = (code *)0x123f19;
    test_bson_validate_cold_138();
LAB_00123f19:
    apcStack_890[0] = (code *)0x123f1e;
    test_bson_validate_cold_25();
LAB_00123f1e:
    apcStack_890[0] = (code *)0x123f23;
    test_bson_validate_cold_26();
LAB_00123f23:
    apcStack_890[0] = (code *)0x123f28;
    test_bson_validate_cold_27();
LAB_00123f28:
    apcStack_890[0] = (code *)0x123f30;
    test_bson_validate_cold_135();
LAB_00123f30:
    apcStack_890[0] = (code *)0x123f35;
    test_bson_validate_cold_28();
LAB_00123f35:
    apcStack_890[0] = (code *)0x123f3a;
    test_bson_validate_cold_29();
LAB_00123f3a:
    apcStack_890[0] = (code *)0x123f3f;
    test_bson_validate_cold_30();
LAB_00123f3f:
    apcStack_890[0] = (code *)0x123f47;
    test_bson_validate_cold_132();
LAB_00123f47:
    apcStack_890[0] = (code *)0x123f4c;
    test_bson_validate_cold_31();
LAB_00123f4c:
    apcStack_890[0] = (code *)0x123f51;
    test_bson_validate_cold_32();
LAB_00123f51:
    apcStack_890[0] = (code *)0x123f56;
    test_bson_validate_cold_33();
LAB_00123f56:
    apcStack_890[0] = (code *)0x123f5e;
    test_bson_validate_cold_129();
LAB_00123f5e:
    apcStack_890[0] = (code *)0x123f63;
    test_bson_validate_cold_34();
LAB_00123f63:
    apcStack_890[0] = (code *)0x123f68;
    test_bson_validate_cold_35();
LAB_00123f68:
    apcStack_890[0] = (code *)0x123f6d;
    test_bson_validate_cold_36();
LAB_00123f6d:
    apcStack_890[0] = (code *)0x123f75;
    test_bson_validate_cold_126();
LAB_00123f75:
    apcStack_890[0] = (code *)0x123f7a;
    test_bson_validate_cold_37();
LAB_00123f7a:
    apcStack_890[0] = (code *)0x123f7f;
    test_bson_validate_cold_38();
LAB_00123f7f:
    apcStack_890[0] = (code *)0x123f84;
    test_bson_validate_cold_39();
LAB_00123f84:
    apcStack_890[0] = (code *)0x123f8c;
    test_bson_validate_cold_123();
LAB_00123f8c:
    apcStack_890[0] = (code *)0x123f91;
    test_bson_validate_cold_40();
LAB_00123f91:
    apcStack_890[0] = (code *)0x123f96;
    test_bson_validate_cold_41();
LAB_00123f96:
    apcStack_890[0] = (code *)0x123f9b;
    test_bson_validate_cold_42();
LAB_00123f9b:
    apcStack_890[0] = (code *)0x123fa3;
    test_bson_validate_cold_120();
LAB_00123fa3:
    apcStack_890[0] = (code *)0x123fa8;
    test_bson_validate_cold_43();
LAB_00123fa8:
    apcStack_890[0] = (code *)0x123fad;
    test_bson_validate_cold_44();
LAB_00123fad:
    apcStack_890[0] = (code *)0x123fb2;
    test_bson_validate_cold_45();
LAB_00123fb2:
    apcStack_890[0] = (code *)0x123fba;
    test_bson_validate_cold_117();
LAB_00123fba:
    apcStack_890[0] = (code *)0x123fbf;
    test_bson_validate_cold_46();
LAB_00123fbf:
    apcStack_890[0] = (code *)0x123fc4;
    test_bson_validate_cold_47();
LAB_00123fc4:
    apcStack_890[0] = (code *)0x123fc9;
    test_bson_validate_cold_48();
LAB_00123fc9:
    apcStack_890[0] = (code *)0x123fd1;
    test_bson_validate_cold_114();
LAB_00123fd1:
    apcStack_890[0] = (code *)0x123fd6;
    test_bson_validate_cold_49();
LAB_00123fd6:
    apcStack_890[0] = (code *)0x123fdb;
    test_bson_validate_cold_50();
LAB_00123fdb:
    apcStack_890[0] = (code *)0x123fe0;
    test_bson_validate_cold_51();
LAB_00123fe0:
    apcStack_890[0] = (code *)0x123fe8;
    test_bson_validate_cold_111();
LAB_00123fe8:
    apcStack_890[0] = (code *)0x123fed;
    test_bson_validate_cold_52();
LAB_00123fed:
    apcStack_890[0] = (code *)0x123ff2;
    test_bson_validate_cold_53();
LAB_00123ff2:
    apcStack_890[0] = (code *)0x123ff7;
    test_bson_validate_cold_54();
LAB_00123ff7:
    apcStack_890[0] = (code *)0x123fff;
    test_bson_validate_cold_108();
LAB_00123fff:
    apcStack_890[0] = (code *)0x124004;
    test_bson_validate_cold_55();
LAB_00124004:
    apcStack_890[0] = (code *)0x124009;
    test_bson_validate_cold_56();
LAB_00124009:
    apcStack_890[0] = (code *)0x12400e;
    test_bson_validate_cold_57();
LAB_0012400e:
    apcStack_890[0] = (code *)0x124016;
    test_bson_validate_cold_105();
LAB_00124016:
    apcStack_890[0] = (code *)0x12401b;
    test_bson_validate_cold_58();
LAB_0012401b:
    apcStack_890[0] = (code *)0x124020;
    test_bson_validate_cold_59();
LAB_00124020:
    apcStack_890[0] = (code *)0x124025;
    test_bson_validate_cold_60();
LAB_00124025:
    apcStack_890[0] = (code *)0x12402d;
    test_bson_validate_cold_102();
LAB_0012402d:
    apcStack_890[0] = (code *)0x124032;
    test_bson_validate_cold_61();
LAB_00124032:
    apcStack_890[0] = (code *)0x124037;
    test_bson_validate_cold_62();
LAB_00124037:
    apcStack_890[0] = (code *)0x12403c;
    test_bson_validate_cold_63();
LAB_0012403c:
    apcStack_890[0] = (code *)0x124044;
    test_bson_validate_cold_99();
LAB_00124044:
    apcStack_890[0] = (code *)0x124049;
    test_bson_validate_cold_64();
LAB_00124049:
    apcStack_890[0] = (code *)0x12404e;
    test_bson_validate_cold_65();
LAB_0012404e:
    apcStack_890[0] = (code *)0x124053;
    test_bson_validate_cold_66();
LAB_00124053:
    apcStack_890[0] = (code *)0x12405b;
    test_bson_validate_cold_96();
LAB_0012405b:
    apcStack_890[0] = (code *)0x124060;
    test_bson_validate_cold_67();
LAB_00124060:
    apcStack_890[0] = (code *)0x124065;
    test_bson_validate_cold_68();
LAB_00124065:
    apcStack_890[0] = (code *)0x12406a;
    test_bson_validate_cold_69();
LAB_0012406a:
    apcStack_890[0] = (code *)0x124072;
    test_bson_validate_cold_93();
LAB_00124072:
    apcStack_890[0] = (code *)0x124077;
    test_bson_validate_cold_70();
LAB_00124077:
    apcStack_890[0] = (code *)0x12407c;
    test_bson_validate_cold_71();
LAB_0012407c:
    apcStack_890[0] = (code *)0x124081;
    test_bson_validate_cold_72();
LAB_00124081:
    apcStack_890[0] = (code *)0x124089;
    test_bson_validate_cold_90();
LAB_00124089:
    apcStack_890[0] = (code *)0x12408e;
    test_bson_validate_cold_76();
LAB_0012408e:
    apcStack_890[0] = (code *)0x124093;
    test_bson_validate_cold_77();
LAB_00124093:
    apcStack_890[0] = (code *)0x12409b;
    test_bson_validate_cold_88();
LAB_0012409b:
    apcStack_890[0] = (code *)0x1240a0;
    test_bson_validate_cold_79();
LAB_001240a0:
    apcStack_890[0] = (code *)0x1240a5;
    test_bson_validate_cold_80();
LAB_001240a5:
    apcStack_890[0] = (code *)0x1240ad;
    test_bson_validate_cold_86();
LAB_001240ad:
    apcStack_890[0] = (code *)0x1240b2;
    test_bson_validate_cold_82();
LAB_001240b2:
    apcStack_890[0] = (code *)0x1240b7;
    test_bson_validate_cold_83();
  }
  else {
    apcStack_890[0] = (code *)0x122e65;
    bson_destroy(pbVar7);
    apcStack_890[0] = (code *)0x122e71;
    pbVar7 = get_bson("empty_key.bson");
    apcStack_890[0] = (code *)0x122e86;
    cVar1 = bson_validate(pbVar7,7,&lStack_880);
    if (cVar1 == '\0') goto LAB_00123d65;
    apcStack_890[0] = (code *)0x122e96;
    bson_destroy(pbVar7);
    apcStack_890[0] = (code *)0x122ea2;
    pcVar5 = (char *)get_bson("overflow2.bson");
    apcStack_890[0] = (code *)0x122eb4;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123d6a;
    ppcVar12 = apcStack_480;
    if (lStack_880 != 9) goto LAB_00123e78;
    apcStack_890[0] = (code *)0x122eda;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123d6f;
    ppcVar12 = apcStack_480;
    if (iStack_878 != 3) goto LAB_00123e7d;
    __haystack = apcStack_480;
    if (iStack_874 != 0) goto LAB_00123e82;
    __haystack = (code **)auStack_870;
    apcStack_890[0] = (code *)0x122f0f;
    pcVar8 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar8 == (char *)0x0) goto LAB_00123e87;
    apcStack_890[0] = (code *)0x122f20;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x122f2c;
    pcVar5 = (char *)get_bson("trailingnull.bson");
    apcStack_890[0] = (code *)0x122f3e;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123d74;
    if (lStack_880 != 0xe) goto LAB_00123e8f;
    apcStack_890[0] = (code *)0x122f64;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123d79;
    if (iStack_878 != 3) goto LAB_00123e94;
    if (iStack_874 != 0) goto LAB_00123e99;
    apcStack_890[0] = (code *)0x122f94;
    pcVar8 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar8 == (char *)0x0) goto LAB_00123e9e;
    apcStack_890[0] = (code *)0x122fa5;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x122fb1;
    pcVar5 = (char *)get_bson("dollarquery.bson");
    apcStack_890[0] = (code *)0x122fc6;
    cVar1 = bson_validate(pcVar5,6,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123d7e;
    if (lStack_880 != 4) goto LAB_00123ea6;
    apcStack_890[0] = (code *)0x122fef;
    cVar1 = bson_validate_with_error(pcVar5,6,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123d83;
    if (iStack_878 != 3) goto LAB_00123eab;
    if (iStack_874 != 2) goto LAB_00123eb0;
    apcStack_890[0] = (code *)0x123020;
    pcVar8 = strstr((char *)__haystack,"keys cannot begin with \"$\": \"$query\"");
    if (pcVar8 == (char *)0x0) goto LAB_00123eb5;
    apcStack_890[0] = (code *)0x123031;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x12303d;
    pcVar5 = (char *)get_bson("dotquery.bson");
    apcStack_890[0] = (code *)0x123052;
    cVar1 = bson_validate(pcVar5,6,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123d88;
    if (lStack_880 != 4) goto LAB_00123ebd;
    apcStack_890[0] = (code *)0x12307b;
    cVar1 = bson_validate_with_error(pcVar5,6,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123d8d;
    if (iStack_878 != 3) goto LAB_00123ec2;
    if (iStack_874 != 4) goto LAB_00123ec7;
    apcStack_890[0] = (code *)0x1230ac;
    pcVar8 = strstr((char *)__haystack,"keys cannot contain \".\": \"abc.def\"");
    if (pcVar8 == (char *)0x0) goto LAB_00123ecc;
    apcStack_890[0] = (code *)0x1230bd;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x1230c9;
    pcVar5 = (char *)get_bson("overflow3.bson");
    apcStack_890[0] = (code *)0x1230db;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123d92;
    if (lStack_880 != 9) goto LAB_00123ed4;
    apcStack_890[0] = (code *)0x123101;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123d97;
    if (iStack_878 != 3) goto LAB_00123ed9;
    if (iStack_874 != 0) goto LAB_00123ede;
    apcStack_890[0] = (code *)0x123131;
    pcVar8 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar8 == (char *)0x0) goto LAB_00123ee3;
    apcStack_890[0] = (code *)0x123142;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x12314e;
    pcVar5 = (char *)get_bson("overflow3.bson");
    apcStack_890[0] = (code *)0x123163;
    cVar1 = bson_validate(pcVar5,1,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123d9c;
    if (lStack_880 != 9) goto LAB_00123eeb;
    apcStack_890[0] = (code *)0x12318c;
    cVar1 = bson_validate_with_error(pcVar5,1,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123da1;
    if (iStack_878 != 3) goto LAB_00123ef0;
    if (iStack_874 != 0) goto LAB_00123ef5;
    apcStack_890[0] = (code *)0x1231bc;
    pcVar8 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar8 == (char *)0x0) goto LAB_00123efa;
    apcStack_890[0] = (code *)0x1231cd;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x1231d9;
    pcVar5 = (char *)get_bson("overflow4.bson");
    apcStack_890[0] = (code *)0x1231eb;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123da6;
    if (lStack_880 != 9) goto LAB_00123f02;
    apcStack_890[0] = (code *)0x123211;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123dab;
    if (iStack_878 != 3) goto LAB_00123f07;
    if (iStack_874 != 0) goto LAB_00123f0c;
    apcStack_890[0] = (code *)0x123241;
    pcVar8 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar8 == (char *)0x0) goto LAB_00123f11;
    apcStack_890[0] = (code *)0x123252;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x12325e;
    pcVar5 = (char *)get_bson("empty_key.bson");
    apcStack_890[0] = (code *)0x123273;
    cVar1 = bson_validate(pcVar5,0x10,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123db0;
    if (lStack_880 != 4) goto LAB_00123f19;
    apcStack_890[0] = (code *)0x12329c;
    cVar1 = bson_validate_with_error(pcVar5,0x10,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123db5;
    if (iStack_878 != 3) goto LAB_00123f1e;
    if (iStack_874 != 0x10) goto LAB_00123f23;
    apcStack_890[0] = (code *)0x1232cd;
    pcVar8 = strstr((char *)__haystack,"empty key");
    if (pcVar8 == (char *)0x0) goto LAB_00123f28;
    apcStack_890[0] = (code *)0x1232de;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x1232ea;
    pcVar5 = (char *)get_bson("test40.bson");
    apcStack_890[0] = (code *)0x1232fc;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123dba;
    if (lStack_880 != 6) goto LAB_00123f30;
    apcStack_890[0] = (code *)0x123322;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123dbf;
    if (iStack_878 != 3) goto LAB_00123f35;
    if (iStack_874 != 0) goto LAB_00123f3a;
    apcStack_890[0] = (code *)0x123352;
    pcVar8 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar8 == (char *)0x0) goto LAB_00123f3f;
    apcStack_890[0] = (code *)0x123363;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x12336f;
    pcVar5 = (char *)get_bson("test41.bson");
    apcStack_890[0] = (code *)0x123381;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123dc4;
    if (lStack_880 != 6) goto LAB_00123f47;
    apcStack_890[0] = (code *)0x1233a7;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123dc9;
    if (iStack_878 != 3) goto LAB_00123f4c;
    if (iStack_874 != 0) goto LAB_00123f51;
    apcStack_890[0] = (code *)0x1233d7;
    pcVar8 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar8 == (char *)0x0) goto LAB_00123f56;
    apcStack_890[0] = (code *)0x1233e8;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x1233f4;
    pcVar5 = (char *)get_bson("test42.bson");
    apcStack_890[0] = (code *)0x123406;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123dce;
    if (lStack_880 != 6) goto LAB_00123f5e;
    apcStack_890[0] = (code *)0x12342c;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123dd3;
    if (iStack_878 != 3) goto LAB_00123f63;
    if (iStack_874 != 0) goto LAB_00123f68;
    apcStack_890[0] = (code *)0x12345c;
    pcVar8 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar8 == (char *)0x0) goto LAB_00123f6d;
    apcStack_890[0] = (code *)0x12346d;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x123479;
    pcVar5 = (char *)get_bson("test43.bson");
    apcStack_890[0] = (code *)0x12348b;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123dd8;
    if (lStack_880 != 6) goto LAB_00123f75;
    apcStack_890[0] = (code *)0x1234b1;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123ddd;
    if (iStack_878 != 3) goto LAB_00123f7a;
    if (iStack_874 != 0) goto LAB_00123f7f;
    apcStack_890[0] = (code *)0x1234e1;
    pcVar8 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar8 == (char *)0x0) goto LAB_00123f84;
    apcStack_890[0] = (code *)0x1234f2;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x1234fe;
    pcVar5 = (char *)get_bson("test44.bson");
    apcStack_890[0] = (code *)0x123510;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123de2;
    if (lStack_880 != 6) goto LAB_00123f8c;
    apcStack_890[0] = (code *)0x123536;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123de7;
    if (iStack_878 != 3) goto LAB_00123f91;
    if (iStack_874 != 0) goto LAB_00123f96;
    apcStack_890[0] = (code *)0x123566;
    pcVar8 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar8 == (char *)0x0) goto LAB_00123f9b;
    apcStack_890[0] = (code *)0x123577;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x123583;
    pcVar5 = (char *)get_bson("test45.bson");
    apcStack_890[0] = (code *)0x123595;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123dec;
    if (lStack_880 != 6) goto LAB_00123fa3;
    apcStack_890[0] = (code *)0x1235bb;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123df1;
    if (iStack_878 != 3) goto LAB_00123fa8;
    if (iStack_874 != 0) goto LAB_00123fad;
    apcStack_890[0] = (code *)0x1235eb;
    pcVar8 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar8 == (char *)0x0) goto LAB_00123fb2;
    apcStack_890[0] = (code *)0x1235fc;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x123608;
    pcVar5 = (char *)get_bson("test46.bson");
    apcStack_890[0] = (code *)0x12361a;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123df6;
    if (lStack_880 != 6) goto LAB_00123fba;
    apcStack_890[0] = (code *)0x123640;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123dfb;
    if (iStack_878 != 3) goto LAB_00123fbf;
    if (iStack_874 != 0) goto LAB_00123fc4;
    apcStack_890[0] = (code *)0x123670;
    pcVar8 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar8 == (char *)0x0) goto LAB_00123fc9;
    apcStack_890[0] = (code *)0x123681;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x12368d;
    pcVar5 = (char *)get_bson("test47.bson");
    apcStack_890[0] = (code *)0x12369f;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123e00;
    if (lStack_880 != 6) goto LAB_00123fd1;
    apcStack_890[0] = (code *)0x1236c5;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123e05;
    if (iStack_878 != 3) goto LAB_00123fd6;
    if (iStack_874 != 0) goto LAB_00123fdb;
    apcStack_890[0] = (code *)0x1236f5;
    pcVar8 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar8 == (char *)0x0) goto LAB_00123fe0;
    apcStack_890[0] = (code *)0x123706;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x123712;
    pcVar5 = (char *)get_bson("test48.bson");
    apcStack_890[0] = (code *)0x123724;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123e0a;
    if (lStack_880 != 6) goto LAB_00123fe8;
    apcStack_890[0] = (code *)0x12374a;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123e0f;
    if (iStack_878 != 3) goto LAB_00123fed;
    if (iStack_874 != 0) goto LAB_00123ff2;
    apcStack_890[0] = (code *)0x12377a;
    pcVar8 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar8 == (char *)0x0) goto LAB_00123ff7;
    apcStack_890[0] = (code *)0x12378b;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x123797;
    pcVar5 = (char *)get_bson("test49.bson");
    apcStack_890[0] = (code *)0x1237a9;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123e14;
    if (lStack_880 != 6) goto LAB_00123fff;
    apcStack_890[0] = (code *)0x1237cf;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123e19;
    if (iStack_878 != 3) goto LAB_00124004;
    if (iStack_874 != 0) goto LAB_00124009;
    apcStack_890[0] = (code *)0x1237ff;
    pcVar8 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar8 == (char *)0x0) goto LAB_0012400e;
    apcStack_890[0] = (code *)0x123810;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x12381c;
    pcVar5 = (char *)get_bson("test50.bson");
    apcStack_890[0] = (code *)0x12382e;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123e1e;
    if (lStack_880 != 10) goto LAB_00124016;
    apcStack_890[0] = (code *)0x123854;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123e23;
    if (iStack_878 != 3) goto LAB_0012401b;
    if (iStack_874 != 0) goto LAB_00124020;
    apcStack_890[0] = (code *)0x123884;
    pcVar8 = strstr((char *)__haystack,"corrupt code-with-scope");
    if (pcVar8 == (char *)0x0) goto LAB_00124025;
    apcStack_890[0] = (code *)0x123895;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x1238a1;
    pcVar5 = (char *)get_bson("test51.bson");
    apcStack_890[0] = (code *)0x1238b3;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123e28;
    if (lStack_880 != 10) goto LAB_0012402d;
    apcStack_890[0] = (code *)0x1238d9;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123e2d;
    if (iStack_878 != 3) goto LAB_00124032;
    if (iStack_874 != 0) goto LAB_00124037;
    apcStack_890[0] = (code *)0x123909;
    pcVar8 = strstr((char *)__haystack,"corrupt code-with-scope");
    if (pcVar8 == (char *)0x0) goto LAB_0012403c;
    apcStack_890[0] = (code *)0x12391a;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x123926;
    pcVar5 = (char *)get_bson("test52.bson");
    apcStack_890[0] = (code *)0x123938;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123e32;
    if (lStack_880 != 9) goto LAB_00124044;
    apcStack_890[0] = (code *)0x12395e;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123e37;
    if (iStack_878 != 3) goto LAB_00124049;
    if (iStack_874 != 0) goto LAB_0012404e;
    apcStack_890[0] = (code *)0x12398e;
    pcVar8 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar8 == (char *)0x0) goto LAB_00124053;
    apcStack_890[0] = (code *)0x12399f;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x1239ab;
    pcVar5 = (char *)get_bson("test53.bson");
    apcStack_890[0] = (code *)0x1239bd;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123e3c;
    if (lStack_880 != 6) goto LAB_0012405b;
    apcStack_890[0] = (code *)0x1239e3;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123e41;
    if (iStack_878 != 3) goto LAB_00124060;
    if (iStack_874 != 0) goto LAB_00124065;
    apcStack_890[0] = (code *)0x123a13;
    pcVar8 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar8 == (char *)0x0) goto LAB_0012406a;
    apcStack_890[0] = (code *)0x123a24;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x123a30;
    pcVar5 = (char *)get_bson("test54.bson");
    apcStack_890[0] = (code *)0x123a42;
    cVar1 = bson_validate(pcVar5,0,&lStack_880);
    if (cVar1 != '\0') goto LAB_00123e46;
    if (lStack_880 != 0xc) goto LAB_00124072;
    apcStack_890[0] = (code *)0x123a68;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123e4b;
    if (iStack_878 != 3) goto LAB_00124077;
    if (iStack_874 != 0) goto LAB_0012407c;
    apcStack_890[0] = (code *)0x123a98;
    pcVar8 = strstr((char *)__haystack,"corrupt BSON");
    if (pcVar8 == (char *)0x0) goto LAB_00124081;
    apcStack_890[0] = (code *)0x123aa9;
    bson_destroy(pcVar5);
    apcStack_890[0] = (code *)0x123aae;
    pcVar5 = (char *)bson_bcon_magic();
    pbVar7 = (bson_t *)0x14ad57;
    plVar13 = (long *)0x14b008;
    pcStack_898 = (char *)0x0;
    pbStack_8a0 = (bson_t *)0x14ad57;
    pbStack_8a8 = (bson_t *)0x1;
    plStack_8b0 = (long *)0xf;
    pcStack_8c0 = "$id";
    pcStack_8c8 = "collection";
    uStack_8d0 = 0x123afe;
    pbStack_8b8 = (bson_t *)pcVar5;
    pcVar16 = (char *)bcon_new(0,"my_dbref","{","$ref",pcVar5,0);
    apcStack_890[0] = (code *)0x123b14;
    cVar1 = bson_validate_with_error(pcVar16,0,&iStack_878);
    if (cVar1 == '\0') goto LAB_00123e50;
    apcStack_890[0] = (code *)0x123b2e;
    cVar1 = bson_validate_with_error(pcVar16,2,&iStack_878);
    if (cVar1 == '\0') goto LAB_00123e55;
    apcStack_890[0] = (code *)0x123b3e;
    bson_destroy(pcVar16);
    pcVar16 = "$id";
    pcStack_898 = (char *)0x0;
    pbStack_8a0 = (bson_t *)0x14ad57;
    pbStack_8a8 = (bson_t *)0x1;
    plStack_8b0 = (long *)0x123b71;
    pbVar3 = (bson_t *)bcon_new(0,"my_dbref","{","$id",pcVar5,0xf);
    apcStack_890[0] = (code *)0x123b87;
    cVar1 = bson_validate_with_error(pbVar3,0,&iStack_878);
    if (cVar1 == '\0') goto LAB_00123e5a;
    apcStack_890[0] = (code *)0x123ba1;
    cVar1 = bson_validate_with_error(pbVar3,2,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123e5f;
    if (iStack_878 != 3) goto LAB_00124089;
    if (iStack_874 != 2) goto LAB_0012408e;
    apcStack_890[0] = (code *)0x123bd2;
    pcVar8 = strstr((char *)__haystack,"keys cannot begin with \"$\": \"$id\"");
    if (pcVar8 == (char *)0x0) goto LAB_00124093;
    apcStack_890[0] = (code *)0x123be3;
    bson_destroy(pbVar3);
    pcStack_898 = (char *)0x0;
    pbStack_8a0 = (bson_t *)0x14ad57;
    pbVar3 = (bson_t *)0x147cde;
    pbStack_8a8 = (bson_t *)0x147cde;
    plStack_8b0 = (long *)0x0;
    pcStack_8c0 = "$ref";
    pcStack_8c8 = "collection";
    uStack_8d0 = 0x123c1b;
    pbStack_8b8 = (bson_t *)pcVar5;
    plVar13 = (long *)bcon_new(0,"my_dbref","{","$ref",pcVar5,0);
    apcStack_890[0] = (code *)0x123c31;
    cVar1 = bson_validate_with_error(plVar13,0,&iStack_878);
    if (cVar1 == '\0') goto LAB_00123e64;
    apcStack_890[0] = (code *)0x123c4b;
    cVar1 = bson_validate_with_error(plVar13,2,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123e69;
    if (iStack_878 != 3) goto LAB_0012409b;
    if (iStack_874 != 2) goto LAB_001240a0;
    apcStack_890[0] = (code *)0x123c7c;
    pcVar8 = strstr((char *)__haystack,"keys cannot begin with \"$\": \"$ref\"");
    if (pcVar8 == (char *)0x0) goto LAB_001240a5;
    apcStack_890[0] = (code *)0x123c8d;
    bson_destroy(plVar13);
    pcStack_898 = (char *)0x0;
    pbStack_8a0 = (bson_t *)0x14ad57;
    pbStack_8a8 = (bson_t *)0x1;
    plStack_8b0 = (long *)0xf;
    pcStack_8c0 = "$id";
    pcStack_8c8 = (char *)0x2;
    uStack_8d0 = 0xf;
    pcStack_8e0 = "extra";
    pcStack_8e8 = "collection";
    uStack_8f0 = 0x123cd7;
    pbStack_8d8 = (bson_t *)pcVar5;
    pbStack_8b8 = (bson_t *)pcVar5;
    pcVar5 = (char *)bcon_new(0,"my_dbref","{","$ref",pcVar5,0);
    apcStack_890[0] = (code *)0x123ced;
    cVar1 = bson_validate_with_error(pcVar5,0,&iStack_878);
    if (cVar1 == '\0') goto LAB_00123e6e;
    apcStack_890[0] = (code *)0x123d07;
    cVar1 = bson_validate_with_error(pcVar5,2,&iStack_878);
    if (cVar1 != '\0') goto LAB_00123e73;
    if (iStack_878 != 3) goto LAB_001240ad;
    if (iStack_874 != 2) goto LAB_001240b2;
    apcStack_890[0] = (code *)0x123d38;
    pcVar8 = strstr((char *)__haystack,"invalid key within DBRef subdocument: \"extra\"");
    if (pcVar8 != (char *)0x0) {
      apcStack_890[0] = (code *)0x123d49;
      bson_destroy(pcVar5);
      return;
    }
  }
  apcStack_890[0] = test_bson_validate_dbref;
  test_bson_validate_cold_84();
  apcStack_b88[0] = (code *)0x1240e7;
  pbStack_8b8 = pbVar7;
  plStack_8b0 = plVar13;
  pbStack_8a8 = pbVar3;
  pbStack_8a0 = (bson_t *)pcVar5;
  pcStack_898 = pcVar16;
  apcStack_890[0] = (code *)__haystack;
  bson_init(auStack_b00);
  apcStack_b88[0] = (code *)0x124106;
  bson_append_document_begin(auStack_b00,"dbref",5,auStack_a80);
  apcStack_b88[0] = (code *)0x124127;
  bson_append_utf8(auStack_a80,"$ref",4,"foo",3);
  apcStack_b88[0] = (code *)0x124132;
  bson_append_document_end(auStack_b00,auStack_a80);
  apcStack_b88[0] = (code *)0x124144;
  cVar1 = bson_validate(auStack_b00,2,auStack_b08);
  if (cVar1 == '\0') {
    apcStack_b88[0] = (code *)0x12415c;
    bson_destroy(auStack_b00);
    apcStack_b88[0] = (code *)0x124164;
    bson_init(auStack_b00);
    apcStack_b88[0] = (code *)0x124183;
    bson_append_document_begin(auStack_b00,"dbref",5,auStack_a80);
    apcStack_b88[0] = (code *)0x1241a4;
    bson_append_utf8(auStack_a80,"$ref",4,"foo",3);
    apcStack_b88[0] = (code *)0x1241c5;
    bson_append_utf8(auStack_a80,"extra",5,"field",5);
    apcStack_b88[0] = (code *)0x1241d0;
    bson_append_document_end(auStack_b00,auStack_a80);
    apcStack_b88[0] = (code *)0x1241e2;
    cVar1 = bson_validate(auStack_b00,2,auStack_b08);
    if (cVar1 != '\0') goto LAB_00124ab7;
    apcStack_b88[0] = (code *)0x1241fa;
    bson_destroy(auStack_b00);
    apcStack_b88[0] = (code *)0x124202;
    bson_init(auStack_b00);
    apcStack_b88[0] = (code *)0x124223;
    bson_append_utf8(auStack_b00,"$ref",4,"foo",3);
    apcStack_b88[0] = (code *)0x124244;
    bson_append_utf8(auStack_b00,"$id",3,"bar",3);
    apcStack_b88[0] = (code *)0x124256;
    cVar1 = bson_validate(auStack_b00,2,auStack_b08);
    if (cVar1 != '\0') goto LAB_00124abc;
    apcStack_b88[0] = (code *)0x12426e;
    bson_destroy(auStack_b00);
    apcStack_b88[0] = (code *)0x124276;
    bson_init(auStack_b00);
    apcStack_b88[0] = (code *)0x124295;
    bson_append_document_begin(auStack_b00,"dbref",5,auStack_a80);
    apcStack_b88[0] = (code *)0x1242b6;
    bson_append_utf8(auStack_a80,"extra",5,"field",5);
    apcStack_b88[0] = (code *)0x1242d7;
    bson_append_utf8(auStack_a80,"$ref",4,"foo",3);
    apcStack_b88[0] = (code *)0x1242f8;
    bson_append_utf8(auStack_a80,"$id",3,"bar",3);
    apcStack_b88[0] = (code *)0x124303;
    bson_append_document_end(auStack_b00,auStack_a80);
    apcStack_b88[0] = (code *)0x124315;
    cVar1 = bson_validate(auStack_b00,2,auStack_b08);
    if (cVar1 != '\0') goto LAB_00124ac1;
    apcStack_b88[0] = (code *)0x12432d;
    bson_destroy(auStack_b00);
    apcStack_b88[0] = (code *)0x124335;
    bson_init(auStack_b00);
    apcStack_b88[0] = (code *)0x124354;
    bson_append_document_begin(auStack_b00,"dbref",5,auStack_a80);
    apcStack_b88[0] = (code *)0x124375;
    bson_append_utf8(auStack_a80,"$ref",4,"foo",3);
    apcStack_b88[0] = (code *)0x124396;
    bson_append_utf8(auStack_a80,"$db",3,"bar",3);
    apcStack_b88[0] = (code *)0x1243a1;
    bson_append_document_end(auStack_b00,auStack_a80);
    apcStack_b88[0] = (code *)0x1243b3;
    cVar1 = bson_validate(auStack_b00,2,auStack_b08);
    if (cVar1 != '\0') goto LAB_00124ac6;
    apcStack_b88[0] = (code *)0x1243cb;
    bson_destroy(auStack_b00);
    apcStack_b88[0] = (code *)0x1243d3;
    bson_init(auStack_b00);
    apcStack_b88[0] = (code *)0x1243f2;
    bson_append_document_begin(auStack_b00,"dbref",5,auStack_a80);
    apcStack_b88[0] = (code *)0x12440b;
    bson_append_int32(auStack_a80,"$ref",4,1);
    apcStack_b88[0] = (code *)0x12442c;
    bson_append_utf8(auStack_a80,"$id",3,"bar",3);
    apcStack_b88[0] = (code *)0x124437;
    bson_append_document_end(auStack_b00,auStack_a80);
    apcStack_b88[0] = (code *)0x124449;
    cVar1 = bson_validate(auStack_b00,2,auStack_b08);
    if (cVar1 != '\0') goto LAB_00124acb;
    apcStack_b88[0] = (code *)0x124461;
    bson_destroy(auStack_b00);
    apcStack_b88[0] = (code *)0x124469;
    bson_init(auStack_b00);
    apcStack_b88[0] = (code *)0x124488;
    bson_append_document_begin(auStack_b00,"dbref",5,auStack_a80);
    apcStack_b88[0] = (code *)0x1244a1;
    bson_append_int32(auStack_a80,"$ref",4,1);
    apcStack_b88[0] = (code *)0x1244ac;
    bson_append_document_end(auStack_b00,auStack_a80);
    apcStack_b88[0] = (code *)0x1244be;
    cVar1 = bson_validate(auStack_b00,2,auStack_b08);
    if (cVar1 != '\0') goto LAB_00124ad0;
    apcStack_b88[0] = (code *)0x1244d6;
    bson_destroy(auStack_b00);
    apcStack_b88[0] = (code *)0x1244de;
    bson_init(auStack_b00);
    apcStack_b88[0] = (code *)0x1244fd;
    bson_append_document_begin(auStack_b00,"dbref",5,auStack_a80);
    apcStack_b88[0] = (code *)0x12451e;
    bson_append_utf8(auStack_a80,"$ref",4,"foo",3);
    apcStack_b88[0] = (code *)0x12453f;
    bson_append_utf8(auStack_a80,"$id",3,"bar",3);
    apcStack_b88[0] = (code *)0x124558;
    bson_append_int32(auStack_a80,"$db",3,1);
    apcStack_b88[0] = (code *)0x124563;
    bson_append_document_end(auStack_b00,auStack_a80);
    apcStack_b88[0] = (code *)0x124575;
    cVar1 = bson_validate(auStack_b00,2,auStack_b08);
    if (cVar1 != '\0') goto LAB_00124ad5;
    apcStack_b88[0] = (code *)0x12458d;
    bson_destroy(auStack_b00);
    apcStack_b88[0] = (code *)0x124595;
    bson_init(auStack_b00);
    apcStack_b88[0] = (code *)0x1245b4;
    bson_append_document_begin(auStack_b00,"dbref",5,auStack_a80);
    apcStack_b88[0] = (code *)0x1245d5;
    bson_append_utf8(auStack_a80,"$ref",4,"foo",3);
    apcStack_b88[0] = (code *)0x1245f6;
    bson_append_utf8(auStack_a80,"$id",3,"bar",3);
    apcStack_b88[0] = (code *)0x12460f;
    bson_append_int32(auStack_a80,"$db",3,1);
    apcStack_b88[0] = (code *)0x124630;
    bson_append_utf8(auStack_a80,"extra",5,"field",5);
    apcStack_b88[0] = (code *)0x12463b;
    bson_append_document_end(auStack_b00,auStack_a80);
    apcStack_b88[0] = (code *)0x12464d;
    cVar1 = bson_validate(auStack_b00,2,auStack_b08);
    if (cVar1 != '\0') goto LAB_00124ada;
    apcStack_b88[0] = (code *)0x124665;
    bson_destroy(auStack_b00);
    apcStack_b88[0] = (code *)0x12466d;
    bson_init(auStack_b00);
    apcStack_b88[0] = (code *)0x12468c;
    bson_append_document_begin(auStack_b00,"dbref",5,auStack_a80);
    apcStack_b88[0] = (code *)0x1246ad;
    bson_append_utf8(auStack_a80,"$ref",4,"foo",3);
    apcStack_b88[0] = (code *)0x1246ce;
    bson_append_utf8(auStack_a80,"$id",3,"bar",3);
    apcStack_b88[0] = (code *)0x1246ef;
    bson_append_utf8(auStack_a80,"extra",5,"field",5);
    apcStack_b88[0] = (code *)0x124710;
    bson_append_utf8(auStack_a80,"$db",3,"baz",3);
    apcStack_b88[0] = (code *)0x12471b;
    bson_append_document_end(auStack_b00,auStack_a80);
    apcStack_b88[0] = (code *)0x12472d;
    cVar1 = bson_validate(auStack_b00,2,auStack_b08);
    if (cVar1 != '\0') goto LAB_00124adf;
    apcStack_b88[0] = (code *)0x124745;
    bson_destroy(auStack_b00);
    apcStack_b88[0] = (code *)0x12474d;
    bson_init(auStack_b00);
    apcStack_b88[0] = (code *)0x12476c;
    bson_append_document_begin(auStack_b00,"dbref",5,auStack_a80);
    apcStack_b88[0] = (code *)0x12478d;
    bson_append_utf8(auStack_a80,"$ref",4,"foo",3);
    apcStack_b88[0] = (code *)0x1247ae;
    bson_append_utf8(auStack_a80,"$id",3,"bar",3);
    apcStack_b88[0] = (code *)0x1247b9;
    bson_append_document_end(auStack_b00,auStack_a80);
    apcStack_b88[0] = (code *)0x1247cb;
    cVar1 = bson_validate(auStack_b00,2,auStack_b08);
    if (cVar1 == '\0') goto LAB_00124ae4;
    apcStack_b88[0] = (code *)0x1247e3;
    bson_destroy(auStack_b00);
    apcStack_b88[0] = (code *)0x1247eb;
    bson_init(auStack_b00);
    apcStack_b88[0] = (code *)0x12480a;
    bson_append_document_begin(auStack_b00,"dbref",5,auStack_a80);
    apcStack_b88[0] = (code *)0x12482e;
    bson_append_utf8(auStack_a80,"$ref",4,"foo",3);
    apcStack_b88[0] = (code *)0x124850;
    bson_append_document_begin(auStack_a80,"$id",3,auStack_a00);
    apcStack_b88[0] = (code *)0x12486d;
    bson_append_utf8(auStack_a00,"$ref",4,"foo2",4);
    apcStack_b88[0] = (code *)0x12488a;
    bson_append_utf8(auStack_a00,"$id",3,"bar2",4);
    apcStack_b88[0] = (code *)0x1248ae;
    bson_append_utf8(auStack_a00,"$db",3,"baz2",4);
    apcStack_b88[0] = (code *)0x1248b9;
    bson_append_document_end(auStack_a80,auStack_a00);
    apcStack_b88[0] = (code *)0x1248d6;
    bson_append_utf8(auStack_a80,"$db",3,"baz",3);
    apcStack_b88[0] = (code *)0x1248e1;
    bson_append_document_end(auStack_b00,auStack_a80);
    apcStack_b88[0] = (code *)0x1248f3;
    cVar1 = bson_validate(auStack_b00,2,auStack_b08);
    if (cVar1 == '\0') goto LAB_00124ae9;
    apcStack_b88[0] = (code *)0x12490b;
    bson_destroy(auStack_b00);
    apcStack_b88[0] = (code *)0x124913;
    bson_init(auStack_b00);
    apcStack_b88[0] = (code *)0x124932;
    bson_append_document_begin(auStack_b00,"dbref",5,auStack_a80);
    apcStack_b88[0] = (code *)0x124953;
    bson_append_utf8(auStack_a80,"$ref",4,"foo",3);
    apcStack_b88[0] = (code *)0x124974;
    bson_append_utf8(auStack_a80,"$id",3,"bar",3);
    apcStack_b88[0] = (code *)0x124995;
    bson_append_utf8(auStack_a80,"$db",3,"baz",3);
    apcStack_b88[0] = (code *)0x1249a0;
    bson_append_document_end(auStack_b00,auStack_a80);
    apcStack_b88[0] = (code *)0x1249b2;
    cVar1 = bson_validate(auStack_b00,2,auStack_b08);
    if (cVar1 == '\0') goto LAB_00124aee;
    apcStack_b88[0] = (code *)0x1249ca;
    bson_destroy(auStack_b00);
    apcStack_b88[0] = (code *)0x1249d2;
    bson_init(auStack_b00);
    apcStack_b88[0] = (code *)0x1249f1;
    bson_append_document_begin(auStack_b00,"dbref",5,auStack_a80);
    apcStack_b88[0] = (code *)0x124a12;
    bson_append_utf8(auStack_a80,"$ref",4,"foo",3);
    apcStack_b88[0] = (code *)0x124a33;
    bson_append_utf8(auStack_a80,"$id",3,"bar",3);
    apcStack_b88[0] = (code *)0x124a54;
    bson_append_utf8(auStack_a80,"$db",3,"baz",3);
    apcStack_b88[0] = (code *)0x124a75;
    bson_append_utf8(auStack_a80,"extra",5,"field",5);
    apcStack_b88[0] = (code *)0x124a80;
    bson_append_document_end(auStack_b00,auStack_a80);
    apcStack_b88[0] = (code *)0x124a92;
    cVar1 = bson_validate(auStack_b00,2,auStack_b08);
    if (cVar1 != '\0') {
      apcStack_b88[0] = (code *)0x124aa3;
      bson_destroy(auStack_b00);
      return;
    }
  }
  else {
    apcStack_b88[0] = (code *)0x124ab7;
    test_bson_validate_dbref_cold_14();
LAB_00124ab7:
    apcStack_b88[0] = (code *)0x124abc;
    test_bson_validate_dbref_cold_13();
LAB_00124abc:
    apcStack_b88[0] = (code *)0x124ac1;
    test_bson_validate_dbref_cold_12();
LAB_00124ac1:
    apcStack_b88[0] = (code *)0x124ac6;
    test_bson_validate_dbref_cold_11();
LAB_00124ac6:
    apcStack_b88[0] = (code *)0x124acb;
    test_bson_validate_dbref_cold_10();
LAB_00124acb:
    apcStack_b88[0] = (code *)0x124ad0;
    test_bson_validate_dbref_cold_9();
LAB_00124ad0:
    apcStack_b88[0] = (code *)0x124ad5;
    test_bson_validate_dbref_cold_8();
LAB_00124ad5:
    apcStack_b88[0] = (code *)0x124ada;
    test_bson_validate_dbref_cold_7();
LAB_00124ada:
    apcStack_b88[0] = (code *)0x124adf;
    test_bson_validate_dbref_cold_6();
LAB_00124adf:
    apcStack_b88[0] = (code *)0x124ae4;
    test_bson_validate_dbref_cold_5();
LAB_00124ae4:
    apcStack_b88[0] = (code *)0x124ae9;
    test_bson_validate_dbref_cold_1();
LAB_00124ae9:
    apcStack_b88[0] = (code *)0x124aee;
    test_bson_validate_dbref_cold_2();
LAB_00124aee:
    apcStack_b88[0] = (code *)0x124af3;
    test_bson_validate_dbref_cold_3();
  }
  apcStack_b88[0] = test_bson_validate_bool;
  test_bson_validate_dbref_cold_4();
  _uStack_d90 = 0x100620800000009;
  uStack_d88 = 0;
  lStack_d98 = 0;
  pcStack_e08 = (code *)0x124b38;
  apcStack_b88[0] = (code *)apcStack_890;
  cVar1 = bson_init_static(auStack_d00,&stack0xfffffffffffff270,9);
  if (cVar1 == '\0') {
    pcStack_e08 = (code *)0x124c37;
    test_bson_validate_bool_cold_1();
LAB_00124c37:
    pcStack_e08 = (code *)0x124c3c;
    test_bson_validate_bool_cold_2();
LAB_00124c3c:
    pcStack_e08 = (code *)0x124c41;
    test_bson_validate_bool_cold_3();
LAB_00124c41:
    pcStack_e08 = (code *)0x124c46;
    test_bson_validate_bool_cold_4();
LAB_00124c46:
    pcStack_e08 = (code *)0x124c4b;
    test_bson_validate_bool_cold_5();
LAB_00124c4b:
    pcStack_e08 = (code *)0x124c50;
    test_bson_validate_bool_cold_6();
LAB_00124c50:
    pcStack_e08 = (code *)0x124c55;
    test_bson_validate_bool_cold_7();
LAB_00124c55:
    pcStack_e08 = (code *)0x124c5a;
    test_bson_validate_bool_cold_8();
LAB_00124c5a:
    pcStack_e08 = (code *)0x124c5f;
    test_bson_validate_bool_cold_12();
LAB_00124c5f:
    pcStack_e08 = (code *)0x124c64;
    test_bson_validate_bool_cold_10();
LAB_00124c64:
    pcStack_e08 = (code *)0x124c69;
    test_bson_validate_bool_cold_11();
  }
  else {
    pcStack_e08 = (code *)0x124b54;
    cVar1 = bson_validate(auStack_d00,0,&lStack_d98);
    if (cVar1 == '\0') goto LAB_00124c37;
    pcStack_e08 = (code *)0x124b71;
    cVar1 = bson_iter_init(auStack_d80,auStack_d00);
    if (cVar1 == '\0') goto LAB_00124c3c;
    pcStack_e08 = (code *)0x124b86;
    cVar1 = bson_iter_next(auStack_d80);
    if (cVar1 == '\0') goto LAB_00124c41;
    pcStack_e08 = (code *)0x124b9b;
    iVar2 = bson_iter_type(auStack_d80);
    if (iVar2 != 8) goto LAB_00124c46;
    pcStack_e08 = (code *)0x124bb1;
    cVar1 = bson_iter_bool(auStack_d80);
    if (cVar1 == '\0') goto LAB_00124c4b;
    if (cStack_d89 != '\x01') goto LAB_00124c50;
    _uStack_d90 = CONCAT17(0xff,uStack_d90);
    pcStack_e08 = (code *)0x124bdf;
    cVar1 = bson_init_static(auStack_d00,&stack0xfffffffffffff270,9);
    if (cVar1 == '\0') goto LAB_00124c55;
    pcStack_e08 = (code *)0x124bf7;
    cVar1 = bson_validate(auStack_d00,0,&lStack_d98);
    if (cVar1 != '\0') goto LAB_00124c5a;
    if (lStack_d98 == 7) {
      pcStack_e08 = (code *)0x124c18;
      cVar1 = bson_iter_init(auStack_d80,auStack_d00);
      if (cVar1 == '\0') goto LAB_00124c5f;
      pcStack_e08 = (code *)0x124c29;
      cVar1 = bson_iter_next(auStack_d80);
      if (cVar1 == '\0') {
        return;
      }
      goto LAB_00124c64;
    }
  }
  pcStack_e08 = test_bson_validate_dbpointer;
  test_bson_validate_bool_cold_9();
  uStack_1010 = 0xe072;
  uStack_100e = 0x614171c4e917c9;
  uStack_1020 = 0x1a;
  uStack_101c = 0x200610c;
  uStack_1018 = 0;
  uStack_1016 = 0x6200;
  uStack_1014 = 0xfce15600;
  lStack_1040 = 0;
  puStack_e10 = auStack_b00;
  pcStack_e08 = (code *)apcStack_b88;
  cVar1 = bson_init_static(auStack_f80,&uStack_1020,0x1a);
  if (cVar1 == '\0') {
    test_bson_validate_dbpointer_cold_1();
LAB_00124deb:
    test_bson_validate_dbpointer_cold_2();
LAB_00124df0:
    test_bson_validate_dbpointer_cold_3();
LAB_00124df5:
    test_bson_validate_dbpointer_cold_4();
LAB_00124dfa:
    test_bson_validate_dbpointer_cold_5();
LAB_00124dff:
    test_bson_validate_dbpointer_cold_8();
LAB_00124e04:
    test_bson_validate_dbpointer_cold_9();
LAB_00124e09:
    test_bson_validate_dbpointer_cold_13();
LAB_00124e0e:
    test_bson_validate_dbpointer_cold_11();
LAB_00124e13:
    test_bson_validate_dbpointer_cold_12();
LAB_00124e18:
    test_bson_validate_dbpointer_cold_6();
  }
  else {
    cVar1 = bson_validate(auStack_f80,0,&lStack_1040);
    if (cVar1 == '\0') goto LAB_00124deb;
    cVar1 = bson_iter_init(auStack_1000,auStack_f80);
    if (cVar1 == '\0') goto LAB_00124df0;
    cVar1 = bson_iter_next(auStack_1000);
    if (cVar1 == '\0') goto LAB_00124df5;
    iVar2 = bson_iter_type(auStack_1000);
    if (iVar2 != 0xc) goto LAB_00124dfa;
    bson_iter_dbpointer(auStack_1000,&iStack_1034,&pcStack_1028,auStack_1030);
    if ((pcStack_1028 != "b") && ((*pcStack_1028 != 'b' || (pcStack_1028[1] != '\0'))))
    goto LAB_00124e18;
    if (iStack_1034 == 1) {
      if ((char)uStack_1014 != '\0') goto LAB_00124dff;
      uStack_1014 = CONCAT31(uStack_1014._1_3_,0xff);
      cVar1 = bson_init_static(auStack_f80,&uStack_1020,0x1a);
      if (cVar1 == '\0') goto LAB_00124e04;
      cVar1 = bson_validate(auStack_f80,0,&lStack_1040);
      if (cVar1 != '\0') goto LAB_00124e09;
      if (lStack_1040 != 0xc) goto LAB_00124e22;
      cVar1 = bson_iter_init(auStack_1000,auStack_f80);
      if (cVar1 == '\0') goto LAB_00124e0e;
      cVar1 = bson_iter_next(auStack_1000);
      if (cVar1 == '\0') {
        return;
      }
      goto LAB_00124e13;
    }
  }
  test_bson_validate_dbpointer_cold_7();
LAB_00124e22:
  test_bson_validate_dbpointer_cold_10();
  iVar2 = 1000000;
  do {
    uVar9 = bson_new();
    bson_destroy(uVar9);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return;
}

Assistant:

static void
test_bson_append_int32 (void)
{
   bson_t *b;
   bson_t *b2;

   b = bson_new ();
   BSON_ASSERT (bson_append_int32 (b, "a", -1, -123));
   BSON_ASSERT (bson_append_int32 (b, "c", -1, 0));
   BSON_ASSERT (bson_append_int32 (b, "b", -1, 123));
   b2 = get_bson ("test33.bson");
   BSON_ASSERT_BSON_EQUAL (b, b2);
   bson_destroy (b);
   bson_destroy (b2);
}